

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

bool embree::avx2::CurveNvIntersectorK<8,8>::
     occluded_t<embree::avx2::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx2::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive *pPVar1;
  undefined1 (*pauVar2) [28];
  float *pfVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Primitive PVar14;
  Geometry *pGVar15;
  code *pcVar16;
  RTCFilterFunctionN p_Var17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  long lVar20;
  long lVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  long lVar84;
  undefined1 auVar85 [32];
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined8 uVar92;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [28];
  undefined1 auVar99 [28];
  undefined1 auVar100 [32];
  int iVar101;
  uint uVar102;
  ulong uVar103;
  uint uVar104;
  ulong uVar105;
  byte bVar106;
  long lVar107;
  ulong uVar108;
  bool bVar109;
  undefined4 uVar110;
  undefined8 uVar111;
  float fVar127;
  undefined1 auVar112 [16];
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  float fVar126;
  float fVar128;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar113 [16];
  undefined1 auVar124 [32];
  undefined1 auVar114 [16];
  undefined1 auVar125 [32];
  float fVar132;
  undefined8 uVar133;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  float fVar144;
  undefined1 auVar143 [64];
  undefined1 extraout_var [56];
  float fVar145;
  undefined1 auVar147 [16];
  float fVar146;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar148 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  float fVar158;
  float fVar164;
  undefined1 auVar159 [32];
  undefined1 auVar163 [64];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined8 uVar177;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [64];
  undefined1 auVar200 [64];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar208 [64];
  undefined1 auVar209 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar213 [32];
  undefined1 auVar212 [16];
  undefined1 auVar214 [32];
  undefined1 in_ZMM12 [64];
  undefined1 auVar215 [64];
  undefined1 auVar216 [64];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  undefined8 local_920;
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float local_8e0;
  float fStack_8dc;
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  undefined1 local_800 [32];
  RTCFilterFunctionNArguments local_7d0;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  undefined1 auStack_6d0 [16];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined4 local_5c0;
  undefined4 uStack_5bc;
  undefined4 uStack_5b8;
  undefined4 uStack_5b4;
  undefined4 uStack_5b0;
  undefined4 uStack_5ac;
  undefined4 uStack_5a8;
  undefined4 uStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined1 auStack_570 [16];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined4 local_490;
  undefined4 uStack_48c;
  undefined4 uStack_488;
  undefined4 uStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  int local_420;
  int local_41c;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined1 local_3c0 [32];
  float local_3a0 [4];
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined4 local_2a0;
  undefined4 uStack_29c;
  undefined4 uStack_298;
  undefined4 uStack_294;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [32];
  uint local_1c0;
  uint uStack_1bc;
  uint uStack_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined4 local_160;
  undefined4 uStack_15c;
  undefined4 uStack_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  undefined1 local_120 [32];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar185 [64];
  
  PVar14 = prim[1];
  uVar103 = (ulong)(byte)PVar14;
  lVar84 = uVar103 * 0x19;
  auVar169 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar169 = vinsertps_avx(auVar169,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar18 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar18 = vinsertps_avx(auVar18,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar146 = *(float *)(prim + lVar84 + 0x12);
  auVar169 = vsubps_avx(auVar169,*(undefined1 (*) [16])(prim + lVar84 + 6));
  auVar112._0_4_ = fVar146 * auVar169._0_4_;
  auVar112._4_4_ = fVar146 * auVar169._4_4_;
  auVar112._8_4_ = fVar146 * auVar169._8_4_;
  auVar112._12_4_ = fVar146 * auVar169._12_4_;
  auVar178._0_4_ = fVar146 * auVar18._0_4_;
  auVar178._4_4_ = fVar146 * auVar18._4_4_;
  auVar178._8_4_ = fVar146 * auVar18._8_4_;
  auVar178._12_4_ = fVar146 * auVar18._12_4_;
  auVar169._8_8_ = 0;
  auVar169._0_8_ = *(ulong *)(prim + uVar103 * 4 + 6);
  auVar115 = vpmovsxbd_avx2(auVar169);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar103 * 5 + 6);
  auVar125 = vpmovsxbd_avx2(auVar18);
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar166._8_8_ = 0;
  auVar166._0_8_ = *(ulong *)(prim + uVar103 * 6 + 6);
  auVar122 = vpmovsxbd_avx2(auVar166);
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar103 * 0xb + 6);
  auVar140 = vpmovsxbd_avx2(auVar8);
  auVar140 = vcvtdq2ps_avx(auVar140);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar14 * 0xc) + 6);
  auVar213 = vpmovsxbd_avx2(auVar9);
  auVar213 = vcvtdq2ps_avx(auVar213);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (uint)(byte)PVar14 * 0xc + uVar103 + 6);
  auVar198 = vpmovsxbd_avx2(auVar10);
  auVar198 = vcvtdq2ps_avx(auVar198);
  uVar108 = (ulong)(uint)((int)(uVar103 * 9) * 2);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar108 + 6);
  auVar192 = vpmovsxbd_avx2(auVar11);
  auVar192 = vcvtdq2ps_avx(auVar192);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar108 + uVar103 + 6);
  auVar124 = vpmovsxbd_avx2(auVar12);
  auVar124 = vcvtdq2ps_avx(auVar124);
  uVar108 = (ulong)(uint)((int)(uVar103 * 5) << 2);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar108 + 6);
  auVar134 = vpmovsxbd_avx2(auVar13);
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar189._4_4_ = auVar178._0_4_;
  auVar189._0_4_ = auVar178._0_4_;
  auVar189._8_4_ = auVar178._0_4_;
  auVar189._12_4_ = auVar178._0_4_;
  auVar189._16_4_ = auVar178._0_4_;
  auVar189._20_4_ = auVar178._0_4_;
  auVar189._24_4_ = auVar178._0_4_;
  auVar189._28_4_ = auVar178._0_4_;
  auVar169 = vmovshdup_avx(auVar178);
  uVar177 = auVar169._0_8_;
  auVar221._8_8_ = uVar177;
  auVar221._0_8_ = uVar177;
  auVar221._16_8_ = uVar177;
  auVar221._24_8_ = uVar177;
  auVar169 = vshufps_avx(auVar178,auVar178,0xaa);
  fVar146 = auVar169._0_4_;
  auVar215._0_4_ = fVar146 * auVar122._0_4_;
  fVar145 = auVar169._4_4_;
  auVar215._4_4_ = fVar145 * auVar122._4_4_;
  auVar215._8_4_ = fVar146 * auVar122._8_4_;
  auVar215._12_4_ = fVar145 * auVar122._12_4_;
  auVar215._16_4_ = fVar146 * auVar122._16_4_;
  auVar215._20_4_ = fVar145 * auVar122._20_4_;
  auVar215._28_36_ = in_ZMM12._28_36_;
  auVar215._24_4_ = fVar146 * auVar122._24_4_;
  auVar185._0_4_ = auVar198._0_4_ * fVar146;
  auVar185._4_4_ = auVar198._4_4_ * fVar145;
  auVar185._8_4_ = auVar198._8_4_ * fVar146;
  auVar185._12_4_ = auVar198._12_4_ * fVar145;
  auVar185._16_4_ = auVar198._16_4_ * fVar146;
  auVar185._20_4_ = auVar198._20_4_ * fVar145;
  auVar185._28_36_ = in_ZMM10._28_36_;
  auVar185._24_4_ = auVar198._24_4_ * fVar146;
  auVar190._0_4_ = auVar134._0_4_ * fVar146;
  auVar190._4_4_ = auVar134._4_4_ * fVar145;
  auVar190._8_4_ = auVar134._8_4_ * fVar146;
  auVar190._12_4_ = auVar134._12_4_ * fVar145;
  auVar190._16_4_ = auVar134._16_4_ * fVar146;
  auVar190._20_4_ = auVar134._20_4_ * fVar145;
  auVar190._24_4_ = auVar134._24_4_ * fVar146;
  auVar190._28_4_ = 0;
  auVar169 = vfmadd231ps_fma(auVar215._0_32_,auVar221,auVar125);
  auVar18 = vfmadd231ps_fma(auVar185._0_32_,auVar221,auVar213);
  auVar166 = vfmadd231ps_fma(auVar190,auVar124,auVar221);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar169),auVar189,auVar115);
  auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar189,auVar140);
  auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar192,auVar189);
  auVar217._4_4_ = auVar112._0_4_;
  auVar217._0_4_ = auVar112._0_4_;
  auVar217._8_4_ = auVar112._0_4_;
  auVar217._12_4_ = auVar112._0_4_;
  auVar217._16_4_ = auVar112._0_4_;
  auVar217._20_4_ = auVar112._0_4_;
  auVar217._24_4_ = auVar112._0_4_;
  auVar217._28_4_ = auVar112._0_4_;
  auVar169 = vmovshdup_avx(auVar112);
  uVar177 = auVar169._0_8_;
  auVar222._8_8_ = uVar177;
  auVar222._0_8_ = uVar177;
  auVar222._16_8_ = uVar177;
  auVar222._24_8_ = uVar177;
  auVar169 = vshufps_avx(auVar112,auVar112,0xaa);
  fVar146 = auVar169._0_4_;
  auVar135._0_4_ = fVar146 * auVar122._0_4_;
  fVar145 = auVar169._4_4_;
  auVar135._4_4_ = fVar145 * auVar122._4_4_;
  auVar135._8_4_ = fVar146 * auVar122._8_4_;
  auVar135._12_4_ = fVar145 * auVar122._12_4_;
  auVar135._16_4_ = fVar146 * auVar122._16_4_;
  auVar135._20_4_ = fVar145 * auVar122._20_4_;
  auVar135._24_4_ = fVar146 * auVar122._24_4_;
  auVar135._28_4_ = 0;
  auVar19._4_4_ = auVar198._4_4_ * fVar145;
  auVar19._0_4_ = auVar198._0_4_ * fVar146;
  auVar19._8_4_ = auVar198._8_4_ * fVar146;
  auVar19._12_4_ = auVar198._12_4_ * fVar145;
  auVar19._16_4_ = auVar198._16_4_ * fVar146;
  auVar19._20_4_ = auVar198._20_4_ * fVar145;
  auVar19._24_4_ = auVar198._24_4_ * fVar146;
  auVar19._28_4_ = auVar122._28_4_;
  auVar122._4_4_ = auVar134._4_4_ * fVar145;
  auVar122._0_4_ = auVar134._0_4_ * fVar146;
  auVar122._8_4_ = auVar134._8_4_ * fVar146;
  auVar122._12_4_ = auVar134._12_4_ * fVar145;
  auVar122._16_4_ = auVar134._16_4_ * fVar146;
  auVar122._20_4_ = auVar134._20_4_ * fVar145;
  auVar122._24_4_ = auVar134._24_4_ * fVar146;
  auVar122._28_4_ = fVar145;
  auVar169 = vfmadd231ps_fma(auVar135,auVar222,auVar125);
  auVar9 = vfmadd231ps_fma(auVar19,auVar222,auVar213);
  auVar10 = vfmadd231ps_fma(auVar122,auVar222,auVar124);
  auVar11 = vfmadd231ps_fma(ZEXT1632(auVar169),auVar217,auVar115);
  local_2e0._8_4_ = 0x7fffffff;
  local_2e0._0_8_ = 0x7fffffff7fffffff;
  local_2e0._12_4_ = 0x7fffffff;
  local_2e0._16_4_ = 0x7fffffff;
  local_2e0._20_4_ = 0x7fffffff;
  local_2e0._24_4_ = 0x7fffffff;
  local_2e0._28_4_ = 0x7fffffff;
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar217,auVar140);
  auVar115 = vandps_avx(ZEXT1632(auVar8),local_2e0);
  auVar151._8_4_ = 0x219392ef;
  auVar151._0_8_ = 0x219392ef219392ef;
  auVar151._12_4_ = 0x219392ef;
  auVar151._16_4_ = 0x219392ef;
  auVar151._20_4_ = 0x219392ef;
  auVar151._24_4_ = 0x219392ef;
  auVar151._28_4_ = 0x219392ef;
  auVar115 = vcmpps_avx(auVar115,auVar151,1);
  auVar125 = vblendvps_avx(ZEXT1632(auVar8),auVar151,auVar115);
  auVar115 = vandps_avx(ZEXT1632(auVar18),local_2e0);
  auVar115 = vcmpps_avx(auVar115,auVar151,1);
  auVar122 = vblendvps_avx(ZEXT1632(auVar18),auVar151,auVar115);
  auVar115 = vandps_avx(ZEXT1632(auVar166),local_2e0);
  auVar115 = vcmpps_avx(auVar115,auVar151,1);
  auVar140 = vrcpps_avx(auVar125);
  auVar115 = vblendvps_avx(ZEXT1632(auVar166),auVar151,auVar115);
  auVar188._8_4_ = 0x3f800000;
  auVar188._0_8_ = &DAT_3f8000003f800000;
  auVar188._12_4_ = 0x3f800000;
  auVar188._16_4_ = 0x3f800000;
  auVar188._20_4_ = 0x3f800000;
  auVar188._24_4_ = 0x3f800000;
  auVar188._28_4_ = 0x3f800000;
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar217,auVar192);
  auVar213 = vrcpps_avx(auVar122);
  auVar169 = vfnmadd213ps_fma(auVar125,auVar140,auVar188);
  auVar169 = vfmadd132ps_fma(ZEXT1632(auVar169),auVar140,auVar140);
  auVar18 = vfnmadd213ps_fma(auVar122,auVar213,auVar188);
  auVar18 = vfmadd132ps_fma(ZEXT1632(auVar18),auVar213,auVar213);
  auVar125 = vrcpps_avx(auVar115);
  auVar166 = vfnmadd213ps_fma(auVar115,auVar125,auVar188);
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar103 * 7 + 6));
  auVar166 = vfmadd132ps_fma(ZEXT1632(auVar166),auVar125,auVar125);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar11));
  auVar140._4_4_ = auVar169._4_4_ * auVar115._4_4_;
  auVar140._0_4_ = auVar169._0_4_ * auVar115._0_4_;
  auVar140._8_4_ = auVar169._8_4_ * auVar115._8_4_;
  auVar140._12_4_ = auVar169._12_4_ * auVar115._12_4_;
  auVar140._16_4_ = auVar115._16_4_ * 0.0;
  auVar140._20_4_ = auVar115._20_4_ * 0.0;
  auVar140._24_4_ = auVar115._24_4_ * 0.0;
  auVar140._28_4_ = auVar115._28_4_;
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar103 * 9 + 6));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar11));
  auVar116._0_4_ = auVar169._0_4_ * auVar115._0_4_;
  auVar116._4_4_ = auVar169._4_4_ * auVar115._4_4_;
  auVar116._8_4_ = auVar169._8_4_ * auVar115._8_4_;
  auVar116._12_4_ = auVar169._12_4_ * auVar115._12_4_;
  auVar116._16_4_ = auVar115._16_4_ * 0.0;
  auVar116._20_4_ = auVar115._20_4_ * 0.0;
  auVar116._24_4_ = auVar115._24_4_ * 0.0;
  auVar116._28_4_ = 0;
  auVar134._1_3_ = 0;
  auVar134[0] = PVar14;
  auVar125 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar14 * 0x10 + 6));
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar14 * 0x10 + uVar103 * -2 + 6));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar9));
  auVar213._4_4_ = auVar115._4_4_ * auVar18._4_4_;
  auVar213._0_4_ = auVar115._0_4_ * auVar18._0_4_;
  auVar213._8_4_ = auVar115._8_4_ * auVar18._8_4_;
  auVar213._12_4_ = auVar115._12_4_ * auVar18._12_4_;
  auVar213._16_4_ = auVar115._16_4_ * 0.0;
  auVar213._20_4_ = auVar115._20_4_ * 0.0;
  auVar213._24_4_ = auVar115._24_4_ * 0.0;
  auVar213._28_4_ = auVar115._28_4_;
  auVar115 = vcvtdq2ps_avx(auVar125);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar9));
  auVar198._4_4_ = auVar18._4_4_ * auVar115._4_4_;
  auVar198._0_4_ = auVar18._0_4_ * auVar115._0_4_;
  auVar198._8_4_ = auVar18._8_4_ * auVar115._8_4_;
  auVar198._12_4_ = auVar18._12_4_ * auVar115._12_4_;
  auVar198._16_4_ = auVar115._16_4_ * 0.0;
  auVar198._20_4_ = auVar115._20_4_ * 0.0;
  auVar198._24_4_ = auVar115._24_4_ * 0.0;
  auVar198._28_4_ = auVar115._28_4_;
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar108 + uVar103 + 6));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar8));
  auVar192._4_4_ = auVar115._4_4_ * auVar166._4_4_;
  auVar192._0_4_ = auVar115._0_4_ * auVar166._0_4_;
  auVar192._8_4_ = auVar115._8_4_ * auVar166._8_4_;
  auVar192._12_4_ = auVar115._12_4_ * auVar166._12_4_;
  auVar192._16_4_ = auVar115._16_4_ * 0.0;
  auVar192._20_4_ = auVar115._20_4_ * 0.0;
  auVar192._24_4_ = auVar115._24_4_ * 0.0;
  auVar192._28_4_ = auVar115._28_4_;
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar103 * 0x17 + 6));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar8));
  auVar124._4_4_ = auVar166._4_4_ * auVar115._4_4_;
  auVar124._0_4_ = auVar166._0_4_ * auVar115._0_4_;
  auVar124._8_4_ = auVar166._8_4_ * auVar115._8_4_;
  auVar124._12_4_ = auVar166._12_4_ * auVar115._12_4_;
  auVar124._16_4_ = auVar115._16_4_ * 0.0;
  auVar124._20_4_ = auVar115._20_4_ * 0.0;
  auVar124._24_4_ = auVar115._24_4_ * 0.0;
  auVar124._28_4_ = auVar115._28_4_;
  auVar115 = vpminsd_avx2(auVar140,auVar116);
  auVar125 = vpminsd_avx2(auVar213,auVar198);
  auVar115 = vmaxps_avx(auVar115,auVar125);
  auVar125 = vpminsd_avx2(auVar192,auVar124);
  uVar110 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar194._4_4_ = uVar110;
  auVar194._0_4_ = uVar110;
  auVar194._8_4_ = uVar110;
  auVar194._12_4_ = uVar110;
  auVar194._16_4_ = uVar110;
  auVar194._20_4_ = uVar110;
  auVar194._24_4_ = uVar110;
  auVar194._28_4_ = uVar110;
  auVar125 = vmaxps_avx(auVar125,auVar194);
  auVar115 = vmaxps_avx(auVar115,auVar125);
  local_80._4_4_ = auVar115._4_4_ * 0.99999964;
  local_80._0_4_ = auVar115._0_4_ * 0.99999964;
  local_80._8_4_ = auVar115._8_4_ * 0.99999964;
  local_80._12_4_ = auVar115._12_4_ * 0.99999964;
  local_80._16_4_ = auVar115._16_4_ * 0.99999964;
  local_80._20_4_ = auVar115._20_4_ * 0.99999964;
  local_80._24_4_ = auVar115._24_4_ * 0.99999964;
  local_80._28_4_ = 0x3f7ffffa;
  auVar115 = vpmaxsd_avx2(auVar140,auVar116);
  auVar125 = vpmaxsd_avx2(auVar213,auVar198);
  auVar115 = vminps_avx(auVar115,auVar125);
  auVar125 = vpmaxsd_avx2(auVar192,auVar124);
  uVar110 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar155._4_4_ = uVar110;
  auVar155._0_4_ = uVar110;
  auVar155._8_4_ = uVar110;
  auVar155._12_4_ = uVar110;
  auVar155._16_4_ = uVar110;
  auVar155._20_4_ = uVar110;
  auVar155._24_4_ = uVar110;
  auVar155._28_4_ = uVar110;
  auVar125 = vminps_avx(auVar125,auVar155);
  auVar115 = vminps_avx(auVar115,auVar125);
  auVar125._4_4_ = auVar115._4_4_ * 1.0000004;
  auVar125._0_4_ = auVar115._0_4_ * 1.0000004;
  auVar125._8_4_ = auVar115._8_4_ * 1.0000004;
  auVar125._12_4_ = auVar115._12_4_ * 1.0000004;
  auVar125._16_4_ = auVar115._16_4_ * 1.0000004;
  auVar125._20_4_ = auVar115._20_4_ * 1.0000004;
  auVar125._24_4_ = auVar115._24_4_ * 1.0000004;
  auVar125._28_4_ = auVar115._28_4_;
  auVar134[4] = PVar14;
  auVar134._5_3_ = 0;
  auVar134[8] = PVar14;
  auVar134._9_3_ = 0;
  auVar134[0xc] = PVar14;
  auVar134._13_3_ = 0;
  auVar134[0x10] = PVar14;
  auVar134._17_3_ = 0;
  auVar134[0x14] = PVar14;
  auVar134._21_3_ = 0;
  auVar134[0x18] = PVar14;
  auVar134._25_3_ = 0;
  auVar134[0x1c] = PVar14;
  auVar134._29_3_ = 0;
  auVar115 = vcmpps_avx(local_80,auVar125,2);
  auVar125 = vpcmpgtd_avx2(auVar134,_DAT_0205a920);
  auVar115 = vandps_avx(auVar115,auVar125);
  uVar104 = vmovmskps_avx(auVar115);
  bVar109 = uVar104 != 0;
  if (bVar109) {
    uVar104 = uVar104 & 0xff;
    local_5e0 = mm_lookupmask_ps._16_8_;
    uStack_5d8 = mm_lookupmask_ps._24_8_;
    uStack_5d0 = mm_lookupmask_ps._16_8_;
    uStack_5c8 = mm_lookupmask_ps._24_8_;
    iVar101 = 1 << ((uint)k & 0x1f);
    auVar115._4_4_ = iVar101;
    auVar115._0_4_ = iVar101;
    auVar115._8_4_ = iVar101;
    auVar115._12_4_ = iVar101;
    auVar115._16_4_ = iVar101;
    auVar115._20_4_ = iVar101;
    auVar115._24_4_ = iVar101;
    auVar115._28_4_ = iVar101;
    auVar125 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
    auVar115 = vpand_avx2(auVar115,auVar125);
    local_300 = vpcmpeqd_avx2(auVar115,auVar125);
    local_490 = 0x7fffffff;
    uStack_48c = 0x7fffffff;
    uStack_488 = 0x7fffffff;
    uStack_484 = 0x7fffffff;
    do {
      auVar115 = local_540;
      lVar20 = 0;
      uVar108 = (ulong)uVar104;
      for (uVar103 = uVar108; (uVar103 & 1) == 0; uVar103 = uVar103 >> 1 | 0x8000000000000000) {
        lVar20 = lVar20 + 1;
      }
      uVar108 = uVar108 - 1 & uVar108;
      local_6a0._4_4_ = *(undefined4 *)(prim + lVar20 * 4 + 6);
      local_560._0_4_ = local_6a0._4_4_;
      uVar103 = (ulong)(uint)((int)lVar20 << 6);
      uVar104 = *(uint *)(prim + 2);
      pGVar15 = (context->scene->geometries).items[uVar104].ptr;
      pPVar1 = prim + uVar103 + lVar84 + 0x16;
      uVar177 = *(undefined8 *)pPVar1;
      uVar92 = *(undefined8 *)(pPVar1 + 8);
      auVar18 = *(undefined1 (*) [16])pPVar1;
      auVar169 = *(undefined1 (*) [16])pPVar1;
      if (uVar108 != 0) {
        uVar105 = uVar108 - 1 & uVar108;
        for (uVar22 = uVar108; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
        }
        if (uVar105 != 0) {
          for (; (uVar105 & 1) == 0; uVar105 = uVar105 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_5f0 = *(undefined1 (*) [16])(prim + uVar103 + lVar84 + 0x26);
      local_600 = *(undefined1 (*) [16])(prim + uVar103 + lVar84 + 0x36);
      local_610 = *(undefined1 (*) [16])(prim + uVar103 + lVar84 + 0x46);
      iVar101 = (int)pGVar15[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar166 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar10 = vinsertps_avx(auVar166,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar8 = vsubps_avx(*(undefined1 (*) [16])pPVar1,auVar10);
      uVar110 = auVar8._0_4_;
      auVar165._4_4_ = uVar110;
      auVar165._0_4_ = uVar110;
      auVar165._8_4_ = uVar110;
      auVar165._12_4_ = uVar110;
      auVar166 = vshufps_avx(auVar8,auVar8,0x55);
      auVar8 = vshufps_avx(auVar8,auVar8,0xaa);
      aVar6 = pre->ray_space[k].vx.field_0;
      aVar7 = pre->ray_space[k].vy.field_0;
      fVar146 = pre->ray_space[k].vz.field_0.m128[0];
      fVar145 = pre->ray_space[k].vz.field_0.m128[1];
      fVar126 = pre->ray_space[k].vz.field_0.m128[2];
      fVar127 = pre->ray_space[k].vz.field_0.m128[3];
      auVar179._0_4_ = fVar146 * auVar8._0_4_;
      auVar179._4_4_ = fVar145 * auVar8._4_4_;
      auVar179._8_4_ = fVar126 * auVar8._8_4_;
      auVar179._12_4_ = fVar127 * auVar8._12_4_;
      auVar166 = vfmadd231ps_fma(auVar179,(undefined1  [16])aVar7,auVar166);
      auVar12 = vfmadd231ps_fma(auVar166,(undefined1  [16])aVar6,auVar165);
      auVar166 = vblendps_avx(auVar12,*(undefined1 (*) [16])pPVar1,8);
      auVar9 = vsubps_avx(local_5f0,auVar10);
      uVar110 = auVar9._0_4_;
      auVar180._4_4_ = uVar110;
      auVar180._0_4_ = uVar110;
      auVar180._8_4_ = uVar110;
      auVar180._12_4_ = uVar110;
      auVar8 = vshufps_avx(auVar9,auVar9,0x55);
      auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
      auVar206._0_4_ = fVar146 * auVar9._0_4_;
      auVar206._4_4_ = fVar145 * auVar9._4_4_;
      auVar206._8_4_ = fVar126 * auVar9._8_4_;
      auVar206._12_4_ = fVar127 * auVar9._12_4_;
      auVar8 = vfmadd231ps_fma(auVar206,(undefined1  [16])aVar7,auVar8);
      auVar13 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar6,auVar180);
      auVar8 = vblendps_avx(auVar13,local_5f0,8);
      auVar11 = vsubps_avx(local_600,auVar10);
      uVar110 = auVar11._0_4_;
      auVar186._4_4_ = uVar110;
      auVar186._0_4_ = uVar110;
      auVar186._8_4_ = uVar110;
      auVar186._12_4_ = uVar110;
      auVar9 = vshufps_avx(auVar11,auVar11,0x55);
      auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
      auVar209._0_4_ = fVar146 * auVar11._0_4_;
      auVar209._4_4_ = fVar145 * auVar11._4_4_;
      auVar209._8_4_ = fVar126 * auVar11._8_4_;
      auVar209._12_4_ = fVar127 * auVar11._12_4_;
      auVar9 = vfmadd231ps_fma(auVar209,(undefined1  [16])aVar7,auVar9);
      auVar112 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar6,auVar186);
      auVar9 = vblendps_avx(auVar112,local_600,8);
      auVar11 = vsubps_avx(local_610,auVar10);
      uVar110 = auVar11._0_4_;
      auVar187._4_4_ = uVar110;
      auVar187._0_4_ = uVar110;
      auVar187._8_4_ = uVar110;
      auVar187._12_4_ = uVar110;
      auVar10 = vshufps_avx(auVar11,auVar11,0x55);
      auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
      auVar212._0_4_ = fVar146 * auVar11._0_4_;
      auVar212._4_4_ = fVar145 * auVar11._4_4_;
      auVar212._8_4_ = fVar126 * auVar11._8_4_;
      auVar212._12_4_ = fVar127 * auVar11._12_4_;
      auVar10 = vfmadd231ps_fma(auVar212,(undefined1  [16])aVar7,auVar10);
      auVar178 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar6,auVar187);
      auVar10 = vblendps_avx(auVar178,local_610,8);
      auVar23._4_4_ = uStack_48c;
      auVar23._0_4_ = local_490;
      auVar23._8_4_ = uStack_488;
      auVar23._12_4_ = uStack_484;
      auVar166 = vandps_avx(auVar166,auVar23);
      auVar8 = vandps_avx(auVar8,auVar23);
      auVar11 = vmaxps_avx(auVar166,auVar8);
      auVar166 = vandps_avx(auVar9,auVar23);
      auVar8 = vandps_avx(auVar10,auVar23);
      auVar166 = vmaxps_avx(auVar166,auVar8);
      auVar166 = vmaxps_avx(auVar11,auVar166);
      auVar8 = vmovshdup_avx(auVar166);
      auVar8 = vmaxss_avx(auVar8,auVar166);
      auVar166 = vshufpd_avx(auVar166,auVar166,1);
      auVar166 = vmaxss_avx(auVar166,auVar8);
      lVar20 = (long)iVar101 * 0x44;
      auVar8 = vmovshdup_avx(auVar12);
      uVar111 = auVar8._0_8_;
      local_5a0._8_8_ = uVar111;
      local_5a0._0_8_ = uVar111;
      local_5a0._16_8_ = uVar111;
      local_5a0._24_8_ = uVar111;
      auVar8 = vmovshdup_avx(auVar13);
      uVar111 = auVar8._0_8_;
      local_520._8_8_ = uVar111;
      local_520._0_8_ = uVar111;
      local_520._16_8_ = uVar111;
      local_520._24_8_ = uVar111;
      auVar125 = *(undefined1 (*) [32])(bspline_basis0 + lVar20 + 0x908);
      uVar110 = auVar112._0_4_;
      local_680._4_4_ = uVar110;
      local_680._0_4_ = uVar110;
      local_680._8_4_ = uVar110;
      local_680._12_4_ = uVar110;
      local_680._16_4_ = uVar110;
      local_680._20_4_ = uVar110;
      local_680._24_4_ = uVar110;
      local_680._28_4_ = uVar110;
      auVar8 = vmovshdup_avx(auVar112);
      uVar111 = auVar8._0_8_;
      auVar210._8_8_ = uVar111;
      auVar210._0_8_ = uVar111;
      auVar210._16_8_ = uVar111;
      auVar210._24_8_ = uVar111;
      fVar146 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar20 + 0xd8c);
      auVar98 = *(undefined1 (*) [28])(bspline_basis0 + lVar20 + 0xd8c);
      local_720 = auVar178._0_4_;
      auVar8 = vmovshdup_avx(auVar178);
      uVar111 = auVar8._0_8_;
      auVar24._4_4_ = local_720 * *(float *)(bspline_basis0 + lVar20 + 0xd90);
      auVar24._0_4_ = local_720 * fVar146;
      auVar24._8_4_ = local_720 * *(float *)(bspline_basis0 + lVar20 + 0xd94);
      auVar24._12_4_ = local_720 * *(float *)(bspline_basis0 + lVar20 + 0xd98);
      auVar24._16_4_ = local_720 * *(float *)(bspline_basis0 + lVar20 + 0xd9c);
      auVar24._20_4_ = local_720 * *(float *)(bspline_basis0 + lVar20 + 0xda0);
      auVar24._24_4_ = local_720 * *(float *)(bspline_basis0 + lVar20 + 0xda4);
      auVar24._28_4_ = *(undefined4 *)(bspline_basis0 + lVar20 + 0xda8);
      auVar9 = vfmadd231ps_fma(auVar24,auVar125,local_680);
      fVar158 = auVar8._0_4_;
      auVar218._0_4_ = fVar158 * fVar146;
      fVar164 = auVar8._4_4_;
      auVar218._4_4_ = fVar164 * *(float *)(bspline_basis0 + lVar20 + 0xd90);
      auVar218._8_4_ = fVar158 * *(float *)(bspline_basis0 + lVar20 + 0xd94);
      auVar218._12_4_ = fVar164 * *(float *)(bspline_basis0 + lVar20 + 0xd98);
      auVar218._16_4_ = fVar158 * *(float *)(bspline_basis0 + lVar20 + 0xd9c);
      auVar218._20_4_ = fVar164 * *(float *)(bspline_basis0 + lVar20 + 0xda0);
      auVar218._24_4_ = fVar158 * *(float *)(bspline_basis0 + lVar20 + 0xda4);
      auVar218._28_4_ = 0;
      auVar8 = vfmadd231ps_fma(auVar218,auVar125,auVar210);
      auVar122 = *(undefined1 (*) [32])(bspline_basis0 + lVar20 + 0x484);
      uVar110 = auVar13._0_4_;
      auVar220._4_4_ = uVar110;
      auVar220._0_4_ = uVar110;
      auVar220._8_4_ = uVar110;
      auVar220._12_4_ = uVar110;
      auVar220._16_4_ = uVar110;
      auVar220._20_4_ = uVar110;
      auVar220._24_4_ = uVar110;
      auVar220._28_4_ = uVar110;
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar122,auVar220);
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar122,local_520);
      auVar140 = *(undefined1 (*) [32])(bspline_basis0 + lVar20);
      local_660._0_4_ = auVar12._0_4_;
      auVar195._4_4_ = local_660._0_4_;
      auVar195._0_4_ = local_660._0_4_;
      auVar195._8_4_ = local_660._0_4_;
      auVar195._12_4_ = local_660._0_4_;
      auVar195._16_4_ = local_660._0_4_;
      auVar195._20_4_ = local_660._0_4_;
      auVar195._24_4_ = local_660._0_4_;
      auVar195._28_4_ = local_660._0_4_;
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar140,auVar195);
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar140,local_5a0);
      auVar213 = *(undefined1 (*) [32])(bspline_basis1 + lVar20 + 0x908);
      fVar131 = *(float *)(bspline_basis1 + lVar20 + 0xd8c);
      fVar86 = *(float *)(bspline_basis1 + lVar20 + 0xd90);
      fVar87 = *(float *)(bspline_basis1 + lVar20 + 0xd94);
      fVar88 = *(float *)(bspline_basis1 + lVar20 + 0xd98);
      fVar89 = *(float *)(bspline_basis1 + lVar20 + 0xd9c);
      fVar90 = *(float *)(bspline_basis1 + lVar20 + 0xda0);
      fVar91 = *(float *)(bspline_basis1 + lVar20 + 0xda4);
      auVar25._4_4_ = local_720 * fVar86;
      auVar25._0_4_ = local_720 * fVar131;
      auVar25._8_4_ = local_720 * fVar87;
      auVar25._12_4_ = local_720 * fVar88;
      auVar25._16_4_ = local_720 * fVar89;
      auVar25._20_4_ = local_720 * fVar90;
      auVar25._24_4_ = local_720 * fVar91;
      auVar25._28_4_ = *(undefined4 *)(bspline_basis0 + lVar20 + 0xda8);
      auVar10 = vfmadd231ps_fma(auVar25,auVar213,local_680);
      auVar26._4_4_ = fVar164 * fVar86;
      auVar26._0_4_ = fVar158 * fVar131;
      auVar26._8_4_ = fVar158 * fVar87;
      auVar26._12_4_ = fVar164 * fVar88;
      auVar26._16_4_ = fVar158 * fVar89;
      auVar26._20_4_ = fVar164 * fVar90;
      auVar26._24_4_ = fVar158 * fVar91;
      auVar26._28_4_ = local_720;
      auVar11 = vfmadd231ps_fma(auVar26,auVar213,auVar210);
      auVar198 = *(undefined1 (*) [32])(bspline_basis1 + lVar20 + 0x484);
      auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar198,auVar220);
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar198,local_520);
      auVar192 = *(undefined1 (*) [32])(bspline_basis1 + lVar20);
      auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar192,auVar195);
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar192,local_5a0);
      auVar116 = ZEXT1632(auVar10);
      auVar135 = ZEXT1632(auVar9);
      auVar134 = vsubps_avx(auVar116,auVar135);
      auVar151 = ZEXT1632(auVar11);
      auVar188 = ZEXT1632(auVar8);
      auVar19 = vsubps_avx(auVar151,auVar188);
      auVar117._0_4_ = auVar8._0_4_ * auVar134._0_4_;
      auVar117._4_4_ = auVar8._4_4_ * auVar134._4_4_;
      auVar117._8_4_ = auVar8._8_4_ * auVar134._8_4_;
      auVar117._12_4_ = auVar8._12_4_ * auVar134._12_4_;
      auVar117._16_4_ = auVar134._16_4_ * 0.0;
      auVar117._20_4_ = auVar134._20_4_ * 0.0;
      auVar117._24_4_ = auVar134._24_4_ * 0.0;
      auVar117._28_4_ = 0;
      fVar146 = auVar19._0_4_;
      auVar136._0_4_ = auVar9._0_4_ * fVar146;
      fVar145 = auVar19._4_4_;
      auVar136._4_4_ = auVar9._4_4_ * fVar145;
      fVar126 = auVar19._8_4_;
      auVar136._8_4_ = auVar9._8_4_ * fVar126;
      fVar127 = auVar19._12_4_;
      auVar136._12_4_ = auVar9._12_4_ * fVar127;
      fVar128 = auVar19._16_4_;
      auVar136._16_4_ = fVar128 * 0.0;
      fVar129 = auVar19._20_4_;
      auVar136._20_4_ = fVar129 * 0.0;
      fVar130 = auVar19._24_4_;
      auVar136._24_4_ = fVar130 * 0.0;
      auVar136._28_4_ = 0;
      auVar155 = vsubps_avx(auVar117,auVar136);
      auVar8 = vpermilps_avx(*(undefined1 (*) [16])pPVar1,0xff);
      uVar133 = auVar8._0_8_;
      local_a0._8_8_ = uVar133;
      local_a0._0_8_ = uVar133;
      local_a0._16_8_ = uVar133;
      local_a0._24_8_ = uVar133;
      auVar9 = vpermilps_avx(local_5f0,0xff);
      uVar133 = auVar9._0_8_;
      local_c0._8_8_ = uVar133;
      local_c0._0_8_ = uVar133;
      local_c0._16_8_ = uVar133;
      local_c0._24_8_ = uVar133;
      auVar9 = vpermilps_avx(local_600,0xff);
      uVar133 = auVar9._0_8_;
      local_e0._8_8_ = uVar133;
      local_e0._0_8_ = uVar133;
      local_e0._16_8_ = uVar133;
      local_e0._24_8_ = uVar133;
      auVar9 = vpermilps_avx(local_610,0xff);
      local_100 = auVar9._0_8_;
      local_960._0_4_ = auVar98._0_4_;
      local_960._4_4_ = auVar98._4_4_;
      fStack_958 = auVar98._8_4_;
      fStack_954 = auVar98._12_4_;
      fStack_950 = auVar98._16_4_;
      fStack_94c = auVar98._20_4_;
      fStack_948 = auVar98._24_4_;
      fVar132 = auVar9._0_4_;
      fVar144 = auVar9._4_4_;
      auVar27._4_4_ = fVar144 * (float)local_960._4_4_;
      auVar27._0_4_ = fVar132 * (float)local_960._0_4_;
      auVar27._8_4_ = fVar132 * fStack_958;
      auVar27._12_4_ = fVar144 * fStack_954;
      auVar27._16_4_ = fVar132 * fStack_950;
      auVar27._20_4_ = fVar144 * fStack_94c;
      auVar27._24_4_ = fVar132 * fStack_948;
      auVar27._28_4_ = uVar110;
      auVar9 = vfmadd231ps_fma(auVar27,local_e0,auVar125);
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar122,local_c0);
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar140,local_a0);
      uStack_f8 = local_100;
      uStack_f0 = local_100;
      uStack_e8 = local_100;
      auVar28._4_4_ = fVar144 * fVar86;
      auVar28._0_4_ = fVar132 * fVar131;
      auVar28._8_4_ = fVar132 * fVar87;
      auVar28._12_4_ = fVar144 * fVar88;
      auVar28._16_4_ = fVar132 * fVar89;
      auVar28._20_4_ = fVar144 * fVar90;
      auVar28._24_4_ = fVar132 * fVar91;
      auVar28._28_4_ = auVar140._28_4_;
      auVar10 = vfmadd231ps_fma(auVar28,auVar213,local_e0);
      auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar198,local_c0);
      auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar192,local_a0);
      auVar29._4_4_ = fVar145 * fVar145;
      auVar29._0_4_ = fVar146 * fVar146;
      auVar29._8_4_ = fVar126 * fVar126;
      auVar29._12_4_ = fVar127 * fVar127;
      auVar29._16_4_ = fVar128 * fVar128;
      auVar29._20_4_ = fVar129 * fVar129;
      auVar29._24_4_ = fVar130 * fVar130;
      auVar29._28_4_ = auVar8._4_4_;
      auVar8 = vfmadd231ps_fma(auVar29,auVar134,auVar134);
      auVar124 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar10));
      auVar30._4_4_ = auVar124._4_4_ * auVar124._4_4_ * auVar8._4_4_;
      auVar30._0_4_ = auVar124._0_4_ * auVar124._0_4_ * auVar8._0_4_;
      auVar30._8_4_ = auVar124._8_4_ * auVar124._8_4_ * auVar8._8_4_;
      auVar30._12_4_ = auVar124._12_4_ * auVar124._12_4_ * auVar8._12_4_;
      auVar30._16_4_ = auVar124._16_4_ * auVar124._16_4_ * 0.0;
      auVar30._20_4_ = auVar124._20_4_ * auVar124._20_4_ * 0.0;
      auVar30._24_4_ = auVar124._24_4_ * auVar124._24_4_ * 0.0;
      auVar30._28_4_ = auVar124._28_4_;
      auVar31._4_4_ = auVar155._4_4_ * auVar155._4_4_;
      auVar31._0_4_ = auVar155._0_4_ * auVar155._0_4_;
      auVar31._8_4_ = auVar155._8_4_ * auVar155._8_4_;
      auVar31._12_4_ = auVar155._12_4_ * auVar155._12_4_;
      auVar31._16_4_ = auVar155._16_4_ * auVar155._16_4_;
      auVar31._20_4_ = auVar155._20_4_ * auVar155._20_4_;
      auVar31._24_4_ = auVar155._24_4_ * auVar155._24_4_;
      auVar31._28_4_ = auVar155._28_4_;
      auVar124 = vcmpps_avx(auVar31,auVar30,2);
      fVar146 = auVar166._0_4_ * 4.7683716e-07;
      auVar118._0_4_ = (float)iVar101;
      local_540._4_12_ = auVar178._4_12_;
      local_540._0_4_ = auVar118._0_4_;
      local_540._16_16_ = auVar115._16_16_;
      auVar118._4_4_ = auVar118._0_4_;
      auVar118._8_4_ = auVar118._0_4_;
      auVar118._12_4_ = auVar118._0_4_;
      auVar118._16_4_ = auVar118._0_4_;
      auVar118._20_4_ = auVar118._0_4_;
      auVar118._24_4_ = auVar118._0_4_;
      auVar118._28_4_ = auVar118._0_4_;
      auVar115 = vcmpps_avx(_DAT_02020f40,auVar118,1);
      auVar8 = vpermilps_avx(auVar12,0xaa);
      uVar133 = auVar8._0_8_;
      local_660._8_8_ = uVar133;
      local_660._0_8_ = uVar133;
      local_660._16_8_ = uVar133;
      local_660._24_8_ = uVar133;
      auVar166 = vpermilps_avx(auVar13,0xaa);
      uVar133 = auVar166._0_8_;
      auVar159._8_8_ = uVar133;
      auVar159._0_8_ = uVar133;
      auVar159._16_8_ = uVar133;
      auVar159._24_8_ = uVar133;
      auVar166 = vpermilps_avx(auVar112,0xaa);
      uVar133 = auVar166._0_8_;
      auVar181._8_8_ = uVar133;
      auVar181._0_8_ = uVar133;
      auVar181._16_8_ = uVar133;
      auVar181._24_8_ = uVar133;
      auVar185 = ZEXT3264(auVar181);
      auVar166 = vshufps_avx(auVar178,auVar178,0xaa);
      uVar133 = auVar166._0_8_;
      register0x00001508 = uVar133;
      local_7a0 = uVar133;
      register0x00001510 = uVar133;
      register0x00001518 = uVar133;
      auVar215 = ZEXT3264(_local_7a0);
      auVar155 = auVar115 & auVar124;
      uVar102 = *(uint *)(ray + k * 4 + 0x60);
      local_780._0_16_ = ZEXT416(uVar102);
      fStack_71c = local_720;
      fStack_718 = local_720;
      fStack_714 = local_720;
      fStack_710 = local_720;
      fStack_70c = local_720;
      fStack_708 = local_720;
      fStack_704 = local_720;
      if ((((((((auVar155 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar155 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar155 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar155 >> 0x7f,0) == '\0') &&
            (auVar155 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar155 >> 0xbf,0) == '\0') &&
          (auVar155 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar155[0x1f]) {
        local_800._0_4_ = 0;
        auVar199 = ZEXT3264(CONCAT428(local_720,
                                      CONCAT424(local_720,
                                                CONCAT420(local_720,
                                                          CONCAT416(local_720,
                                                                    CONCAT412(local_720,
                                                                              CONCAT48(local_720,
                                                                                       CONCAT44(
                                                  local_720,local_720))))))));
        auVar143 = ZEXT3264(CONCAT428(fVar164,CONCAT424(fVar158,CONCAT420(fVar164,CONCAT416(fVar158,
                                                  CONCAT412(fVar164,CONCAT48(fVar158,uVar111)))))));
      }
      else {
        local_5c0 = SUB84(pGVar15,0);
        uStack_5bc = (undefined4)((ulong)pGVar15 >> 0x20);
        auVar124 = vandps_avx(auVar124,auVar115);
        fVar132 = auVar166._0_4_;
        fVar144 = auVar166._4_4_;
        auVar32._4_4_ = fVar144 * fVar86;
        auVar32._0_4_ = fVar132 * fVar131;
        auVar32._8_4_ = fVar132 * fVar87;
        auVar32._12_4_ = fVar144 * fVar88;
        auVar32._16_4_ = fVar132 * fVar89;
        auVar32._20_4_ = fVar144 * fVar90;
        auVar32._24_4_ = fVar132 * fVar91;
        auVar32._28_4_ = auVar124._28_4_;
        auVar166 = vfmadd213ps_fma(auVar213,auVar181,auVar32);
        auVar166 = vfmadd213ps_fma(auVar198,auVar159,ZEXT1632(auVar166));
        auVar166 = vfmadd213ps_fma(auVar192,local_660,ZEXT1632(auVar166));
        _local_4c0 = ZEXT1632(auVar166);
        auVar33._4_4_ = fVar144 * (float)local_960._4_4_;
        auVar33._0_4_ = fVar132 * (float)local_960._0_4_;
        auVar33._8_4_ = fVar132 * fStack_958;
        auVar33._12_4_ = fVar144 * fStack_954;
        auVar33._16_4_ = fVar132 * fStack_950;
        auVar33._20_4_ = fVar144 * fStack_94c;
        auVar33._24_4_ = fVar132 * fStack_948;
        auVar33._28_4_ = auVar124._28_4_;
        auVar166 = vfmadd213ps_fma(auVar125,auVar181,auVar33);
        auVar166 = vfmadd213ps_fma(auVar122,auVar159,ZEXT1632(auVar166));
        auVar115 = *(undefined1 (*) [32])(bspline_basis0 + lVar20 + 0x1210);
        auVar125 = *(undefined1 (*) [32])(bspline_basis0 + lVar20 + 0x1694);
        auVar122 = *(undefined1 (*) [32])(bspline_basis0 + lVar20 + 0x1b18);
        fVar145 = *(float *)(bspline_basis0 + lVar20 + 0x1f9c);
        fVar126 = *(float *)(bspline_basis0 + lVar20 + 0x1fa0);
        fVar127 = *(float *)(bspline_basis0 + lVar20 + 0x1fa4);
        fVar128 = *(float *)(bspline_basis0 + lVar20 + 0x1fa8);
        fVar129 = *(float *)(bspline_basis0 + lVar20 + 0x1fac);
        fVar130 = *(float *)(bspline_basis0 + lVar20 + 0x1fb0);
        fVar131 = *(float *)(bspline_basis0 + lVar20 + 0x1fb4);
        auVar34._4_4_ = local_720 * fVar126;
        auVar34._0_4_ = local_720 * fVar145;
        auVar34._8_4_ = local_720 * fVar127;
        auVar34._12_4_ = local_720 * fVar128;
        auVar34._16_4_ = local_720 * fVar129;
        auVar34._20_4_ = local_720 * fVar130;
        auVar34._24_4_ = local_720 * fVar131;
        auVar34._28_4_ = *(undefined4 *)(bspline_basis1 + lVar20 + 0xda8);
        auVar191._0_4_ = fVar145 * fVar158;
        auVar191._4_4_ = fVar126 * fVar164;
        auVar191._8_4_ = fVar127 * fVar158;
        auVar191._12_4_ = fVar128 * fVar164;
        auVar191._16_4_ = fVar129 * fVar158;
        auVar191._20_4_ = fVar130 * fVar164;
        auVar191._24_4_ = fVar131 * fVar158;
        auVar191._28_4_ = 0;
        auVar207._0_4_ = fVar132 * fVar145;
        auVar207._4_4_ = fVar144 * fVar126;
        auVar207._8_4_ = fVar132 * fVar127;
        auVar207._12_4_ = fVar144 * fVar128;
        auVar207._16_4_ = fVar132 * fVar129;
        auVar207._20_4_ = fVar144 * fVar130;
        auVar207._24_4_ = fVar132 * fVar131;
        auVar207._28_4_ = 0;
        auVar11 = vfmadd231ps_fma(auVar34,auVar122,local_680);
        auVar12 = vfmadd231ps_fma(auVar191,auVar122,auVar210);
        auVar13 = vfmadd231ps_fma(auVar207,auVar181,auVar122);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar125,auVar220);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar125,local_520);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar159,auVar125);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar115,auVar195);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar115,local_5a0);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),local_660,auVar115);
        fVar145 = *(float *)(bspline_basis1 + lVar20 + 0x1f9c);
        fVar126 = *(float *)(bspline_basis1 + lVar20 + 0x1fa0);
        fVar127 = *(float *)(bspline_basis1 + lVar20 + 0x1fa4);
        fVar128 = *(float *)(bspline_basis1 + lVar20 + 0x1fa8);
        fVar129 = *(float *)(bspline_basis1 + lVar20 + 0x1fac);
        fVar130 = *(float *)(bspline_basis1 + lVar20 + 0x1fb0);
        fVar131 = *(float *)(bspline_basis1 + lVar20 + 0x1fb4);
        auVar35._4_4_ = local_720 * fVar126;
        auVar35._0_4_ = local_720 * fVar145;
        auVar35._8_4_ = local_720 * fVar127;
        auVar35._12_4_ = local_720 * fVar128;
        auVar35._16_4_ = local_720 * fVar129;
        auVar35._20_4_ = local_720 * fVar130;
        auVar35._24_4_ = local_720 * fVar131;
        auVar35._28_4_ = auVar8._4_4_;
        auVar36._4_4_ = fVar164 * fVar126;
        auVar36._0_4_ = fVar158 * fVar145;
        auVar36._8_4_ = fVar158 * fVar127;
        auVar36._12_4_ = fVar164 * fVar128;
        auVar36._16_4_ = fVar158 * fVar129;
        auVar36._20_4_ = fVar164 * fVar130;
        auVar36._24_4_ = fVar158 * fVar131;
        auVar36._28_4_ = local_720;
        auVar37._4_4_ = fVar144 * fVar126;
        auVar37._0_4_ = fVar132 * fVar145;
        auVar37._8_4_ = fVar132 * fVar127;
        auVar37._12_4_ = fVar144 * fVar128;
        auVar37._16_4_ = fVar132 * fVar129;
        auVar37._20_4_ = fVar144 * fVar130;
        auVar37._24_4_ = fVar132 * fVar131;
        auVar37._28_4_ = fVar144;
        auVar115 = *(undefined1 (*) [32])(bspline_basis1 + lVar20 + 0x1b18);
        auVar8 = vfmadd231ps_fma(auVar35,auVar115,local_680);
        auVar112 = vfmadd231ps_fma(auVar36,auVar115,auVar210);
        auVar178 = vfmadd231ps_fma(auVar37,auVar181,auVar115);
        auVar115 = *(undefined1 (*) [32])(bspline_basis1 + lVar20 + 0x1694);
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar115,auVar220);
        auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar115,local_520);
        auVar178 = vfmadd231ps_fma(ZEXT1632(auVar178),auVar159,auVar115);
        auVar115 = *(undefined1 (*) [32])(bspline_basis1 + lVar20 + 0x1210);
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar115,auVar195);
        auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar115,local_5a0);
        auVar178 = vfmadd231ps_fma(ZEXT1632(auVar178),local_660,auVar115);
        auVar115 = vandps_avx(local_2e0,ZEXT1632(auVar11));
        auVar125 = vandps_avx(ZEXT1632(auVar12),local_2e0);
        auVar125 = vmaxps_avx(auVar115,auVar125);
        auVar115 = vandps_avx(ZEXT1632(auVar13),local_2e0);
        auVar115 = vmaxps_avx(auVar125,auVar115);
        auVar137._4_4_ = fVar146;
        auVar137._0_4_ = fVar146;
        auVar137._8_4_ = fVar146;
        auVar137._12_4_ = fVar146;
        auVar137._16_4_ = fVar146;
        auVar137._20_4_ = fVar146;
        auVar137._24_4_ = fVar146;
        auVar137._28_4_ = fVar146;
        auVar115 = vcmpps_avx(auVar115,auVar137,1);
        auVar122 = vblendvps_avx(ZEXT1632(auVar11),auVar134,auVar115);
        auVar213 = vblendvps_avx(ZEXT1632(auVar12),auVar19,auVar115);
        auVar115 = vandps_avx(ZEXT1632(auVar8),local_2e0);
        auVar125 = vandps_avx(ZEXT1632(auVar112),local_2e0);
        auVar125 = vmaxps_avx(auVar115,auVar125);
        auVar115 = vandps_avx(ZEXT1632(auVar178),local_2e0);
        auVar115 = vmaxps_avx(auVar125,auVar115);
        auVar125 = vcmpps_avx(auVar115,auVar137,1);
        auVar115 = vblendvps_avx(ZEXT1632(auVar8),auVar134,auVar125);
        auVar125 = vblendvps_avx(ZEXT1632(auVar112),auVar19,auVar125);
        auVar166 = vfmadd213ps_fma(auVar140,local_660,ZEXT1632(auVar166));
        auVar8 = vfmadd213ps_fma(auVar122,auVar122,ZEXT832(0) << 0x20);
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar213,auVar213);
        auVar140 = vrsqrtps_avx(ZEXT1632(auVar8));
        fVar145 = auVar140._0_4_;
        fVar126 = auVar140._4_4_;
        fVar127 = auVar140._8_4_;
        fVar128 = auVar140._12_4_;
        fVar129 = auVar140._16_4_;
        fVar130 = auVar140._20_4_;
        fVar131 = auVar140._24_4_;
        auVar38._4_4_ = fVar126 * fVar126 * fVar126 * auVar8._4_4_ * -0.5;
        auVar38._0_4_ = fVar145 * fVar145 * fVar145 * auVar8._0_4_ * -0.5;
        auVar38._8_4_ = fVar127 * fVar127 * fVar127 * auVar8._8_4_ * -0.5;
        auVar38._12_4_ = fVar128 * fVar128 * fVar128 * auVar8._12_4_ * -0.5;
        auVar38._16_4_ = fVar129 * fVar129 * fVar129 * -0.0;
        auVar38._20_4_ = fVar130 * fVar130 * fVar130 * -0.0;
        auVar38._24_4_ = fVar131 * fVar131 * fVar131 * -0.0;
        auVar38._28_4_ = 0;
        auVar219._8_4_ = 0x3fc00000;
        auVar219._0_8_ = 0x3fc000003fc00000;
        auVar219._12_4_ = 0x3fc00000;
        auVar219._16_4_ = 0x3fc00000;
        auVar219._20_4_ = 0x3fc00000;
        auVar219._24_4_ = 0x3fc00000;
        auVar219._28_4_ = 0x3fc00000;
        auVar8 = vfmadd231ps_fma(auVar38,auVar219,auVar140);
        fVar145 = auVar8._0_4_;
        fVar126 = auVar8._4_4_;
        auVar39._4_4_ = auVar213._4_4_ * fVar126;
        auVar39._0_4_ = auVar213._0_4_ * fVar145;
        fVar127 = auVar8._8_4_;
        auVar39._8_4_ = auVar213._8_4_ * fVar127;
        fVar128 = auVar8._12_4_;
        auVar39._12_4_ = auVar213._12_4_ * fVar128;
        auVar39._16_4_ = auVar213._16_4_ * 0.0;
        auVar39._20_4_ = auVar213._20_4_ * 0.0;
        auVar39._24_4_ = auVar213._24_4_ * 0.0;
        auVar39._28_4_ = auVar140._28_4_;
        auVar40._4_4_ = -auVar122._4_4_ * fVar126;
        auVar40._0_4_ = -auVar122._0_4_ * fVar145;
        auVar40._8_4_ = -auVar122._8_4_ * fVar127;
        auVar40._12_4_ = -auVar122._12_4_ * fVar128;
        auVar40._16_4_ = -auVar122._16_4_ * 0.0;
        auVar40._20_4_ = -auVar122._20_4_ * 0.0;
        auVar40._24_4_ = -auVar122._24_4_ * 0.0;
        auVar40._28_4_ = 0;
        auVar8 = vfmadd213ps_fma(auVar115,auVar115,ZEXT832(0) << 0x20);
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar125,auVar125);
        auVar122 = vrsqrtps_avx(ZEXT1632(auVar8));
        auVar140 = ZEXT1632(CONCAT412(fVar128 * 0.0,
                                      CONCAT48(fVar127 * 0.0,CONCAT44(fVar126 * 0.0,fVar145 * 0.0)))
                           );
        fVar145 = auVar122._0_4_;
        fVar126 = auVar122._4_4_;
        fVar127 = auVar122._8_4_;
        fVar128 = auVar122._12_4_;
        fVar129 = auVar122._16_4_;
        fVar130 = auVar122._20_4_;
        fVar131 = auVar122._24_4_;
        auVar41._4_4_ = fVar126 * fVar126 * fVar126 * auVar8._4_4_ * -0.5;
        auVar41._0_4_ = fVar145 * fVar145 * fVar145 * auVar8._0_4_ * -0.5;
        auVar41._8_4_ = fVar127 * fVar127 * fVar127 * auVar8._8_4_ * -0.5;
        auVar41._12_4_ = fVar128 * fVar128 * fVar128 * auVar8._12_4_ * -0.5;
        auVar41._16_4_ = fVar129 * fVar129 * fVar129 * -0.0;
        auVar41._20_4_ = fVar130 * fVar130 * fVar130 * -0.0;
        auVar41._24_4_ = fVar131 * fVar131 * fVar131 * -0.0;
        auVar41._28_4_ = 0xbf000000;
        auVar8 = vfmadd231ps_fma(auVar41,auVar219,auVar122);
        fVar145 = auVar8._0_4_;
        fVar126 = auVar8._4_4_;
        auVar42._4_4_ = fVar126 * auVar125._4_4_;
        auVar42._0_4_ = fVar145 * auVar125._0_4_;
        fVar127 = auVar8._8_4_;
        auVar42._8_4_ = fVar127 * auVar125._8_4_;
        fVar128 = auVar8._12_4_;
        auVar42._12_4_ = fVar128 * auVar125._12_4_;
        auVar42._16_4_ = auVar125._16_4_ * 0.0;
        auVar42._20_4_ = auVar125._20_4_ * 0.0;
        auVar42._24_4_ = auVar125._24_4_ * 0.0;
        auVar42._28_4_ = 0;
        auVar43._4_4_ = fVar126 * -auVar115._4_4_;
        auVar43._0_4_ = fVar145 * -auVar115._0_4_;
        auVar43._8_4_ = fVar127 * -auVar115._8_4_;
        auVar43._12_4_ = fVar128 * -auVar115._12_4_;
        auVar43._16_4_ = -auVar115._16_4_ * 0.0;
        auVar43._20_4_ = -auVar115._20_4_ * 0.0;
        auVar43._24_4_ = -auVar115._24_4_ * 0.0;
        auVar43._28_4_ = 0x3fc00000;
        auVar44._28_4_ = auVar122._28_4_;
        auVar44._0_28_ =
             ZEXT1628(CONCAT412(fVar128 * 0.0,
                                CONCAT48(fVar127 * 0.0,CONCAT44(fVar126 * 0.0,fVar145 * 0.0))));
        auVar8 = vfmadd213ps_fma(auVar39,ZEXT1632(auVar9),auVar135);
        auVar115 = ZEXT1632(auVar9);
        auVar11 = vfmadd213ps_fma(auVar40,auVar115,auVar188);
        auVar12 = vfmadd213ps_fma(auVar140,auVar115,ZEXT1632(auVar166));
        auVar23 = vfnmadd213ps_fma(auVar39,auVar115,auVar135);
        auVar13 = vfmadd213ps_fma(auVar42,ZEXT1632(auVar10),auVar116);
        auVar165 = vfnmadd213ps_fma(auVar40,auVar115,auVar188);
        auVar189 = ZEXT1632(auVar10);
        auVar10 = vfmadd213ps_fma(auVar43,auVar189,auVar151);
        auVar217 = ZEXT1632(auVar9);
        auVar186 = vfnmadd231ps_fma(ZEXT1632(auVar166),auVar217,auVar140);
        auVar112 = vfmadd213ps_fma(auVar44,auVar189,_local_4c0);
        auVar179 = vfnmadd213ps_fma(auVar42,auVar189,auVar116);
        auVar180 = vfnmadd213ps_fma(auVar43,auVar189,auVar151);
        auVar187 = vfnmadd231ps_fma(_local_4c0,auVar189,auVar44);
        auVar115 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar165));
        auVar125 = vsubps_avx(ZEXT1632(auVar112),ZEXT1632(auVar186));
        auVar152._0_4_ = auVar186._0_4_ * auVar115._0_4_;
        auVar152._4_4_ = auVar186._4_4_ * auVar115._4_4_;
        auVar152._8_4_ = auVar186._8_4_ * auVar115._8_4_;
        auVar152._12_4_ = auVar186._12_4_ * auVar115._12_4_;
        auVar152._16_4_ = auVar115._16_4_ * 0.0;
        auVar152._20_4_ = auVar115._20_4_ * 0.0;
        auVar152._24_4_ = auVar115._24_4_ * 0.0;
        auVar152._28_4_ = 0;
        auVar178 = vfmsub231ps_fma(auVar152,ZEXT1632(auVar165),auVar125);
        auVar45._4_4_ = auVar23._4_4_ * auVar125._4_4_;
        auVar45._0_4_ = auVar23._0_4_ * auVar125._0_4_;
        auVar45._8_4_ = auVar23._8_4_ * auVar125._8_4_;
        auVar45._12_4_ = auVar23._12_4_ * auVar125._12_4_;
        auVar45._16_4_ = auVar125._16_4_ * 0.0;
        auVar45._20_4_ = auVar125._20_4_ * 0.0;
        auVar45._24_4_ = auVar125._24_4_ * 0.0;
        auVar45._28_4_ = auVar125._28_4_;
        auVar192 = ZEXT1632(auVar23);
        auVar125 = vsubps_avx(ZEXT1632(auVar13),auVar192);
        auVar166 = vfmsub231ps_fma(auVar45,ZEXT1632(auVar186),auVar125);
        auVar46._4_4_ = auVar165._4_4_ * auVar125._4_4_;
        auVar46._0_4_ = auVar165._0_4_ * auVar125._0_4_;
        auVar46._8_4_ = auVar165._8_4_ * auVar125._8_4_;
        auVar46._12_4_ = auVar165._12_4_ * auVar125._12_4_;
        auVar46._16_4_ = auVar125._16_4_ * 0.0;
        auVar46._20_4_ = auVar125._20_4_ * 0.0;
        auVar46._24_4_ = auVar125._24_4_ * 0.0;
        auVar46._28_4_ = auVar125._28_4_;
        auVar23 = vfmsub231ps_fma(auVar46,auVar192,auVar115);
        auVar166 = vfmadd231ps_fma(ZEXT1632(auVar23),ZEXT832(0) << 0x20,ZEXT1632(auVar166));
        auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),ZEXT832(0) << 0x20,ZEXT1632(auVar178));
        auVar116 = vcmpps_avx(ZEXT1632(auVar166),ZEXT832(0) << 0x20,2);
        auVar115 = vblendvps_avx(ZEXT1632(auVar179),ZEXT1632(auVar8),auVar116);
        auVar125 = vblendvps_avx(ZEXT1632(auVar180),ZEXT1632(auVar11),auVar116);
        auVar122 = vblendvps_avx(ZEXT1632(auVar187),ZEXT1632(auVar12),auVar116);
        auVar140 = vblendvps_avx(auVar192,ZEXT1632(auVar13),auVar116);
        auVar213 = vblendvps_avx(ZEXT1632(auVar165),ZEXT1632(auVar10),auVar116);
        auVar198 = vblendvps_avx(ZEXT1632(auVar186),ZEXT1632(auVar112),auVar116);
        auVar192 = vblendvps_avx(ZEXT1632(auVar13),auVar192,auVar116);
        auVar134 = vblendvps_avx(ZEXT1632(auVar10),ZEXT1632(auVar165),auVar116);
        auVar166 = vpackssdw_avx(auVar124._0_16_,auVar124._16_16_);
        auVar155 = vblendvps_avx(ZEXT1632(auVar112),ZEXT1632(auVar186),auVar116);
        auVar135 = vsubps_avx(auVar192,auVar115);
        auVar134 = vsubps_avx(auVar134,auVar125);
        auVar151 = vsubps_avx(auVar155,auVar122);
        auVar188 = vsubps_avx(auVar115,auVar140);
        auVar190 = vsubps_avx(auVar125,auVar213);
        auVar194 = vsubps_avx(auVar122,auVar198);
        auVar47._4_4_ = auVar151._4_4_ * auVar115._4_4_;
        auVar47._0_4_ = auVar151._0_4_ * auVar115._0_4_;
        auVar47._8_4_ = auVar151._8_4_ * auVar115._8_4_;
        auVar47._12_4_ = auVar151._12_4_ * auVar115._12_4_;
        auVar47._16_4_ = auVar151._16_4_ * auVar115._16_4_;
        auVar47._20_4_ = auVar151._20_4_ * auVar115._20_4_;
        auVar47._24_4_ = auVar151._24_4_ * auVar115._24_4_;
        auVar47._28_4_ = auVar155._28_4_;
        auVar8 = vfmsub231ps_fma(auVar47,auVar122,auVar135);
        auVar48._4_4_ = auVar135._4_4_ * auVar125._4_4_;
        auVar48._0_4_ = auVar135._0_4_ * auVar125._0_4_;
        auVar48._8_4_ = auVar135._8_4_ * auVar125._8_4_;
        auVar48._12_4_ = auVar135._12_4_ * auVar125._12_4_;
        auVar48._16_4_ = auVar135._16_4_ * auVar125._16_4_;
        auVar48._20_4_ = auVar135._20_4_ * auVar125._20_4_;
        auVar48._24_4_ = auVar135._24_4_ * auVar125._24_4_;
        auVar48._28_4_ = auVar192._28_4_;
        auVar10 = vfmsub231ps_fma(auVar48,auVar115,auVar134);
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT832(0) << 0x20,ZEXT1632(auVar8));
        auVar119._0_4_ = auVar134._0_4_ * auVar122._0_4_;
        auVar119._4_4_ = auVar134._4_4_ * auVar122._4_4_;
        auVar119._8_4_ = auVar134._8_4_ * auVar122._8_4_;
        auVar119._12_4_ = auVar134._12_4_ * auVar122._12_4_;
        auVar119._16_4_ = auVar134._16_4_ * auVar122._16_4_;
        auVar119._20_4_ = auVar134._20_4_ * auVar122._20_4_;
        auVar119._24_4_ = auVar134._24_4_ * auVar122._24_4_;
        auVar119._28_4_ = 0;
        auVar10 = vfmsub231ps_fma(auVar119,auVar125,auVar151);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT832(0) << 0x20,ZEXT1632(auVar10));
        auVar120._0_4_ = auVar194._0_4_ * auVar140._0_4_;
        auVar120._4_4_ = auVar194._4_4_ * auVar140._4_4_;
        auVar120._8_4_ = auVar194._8_4_ * auVar140._8_4_;
        auVar120._12_4_ = auVar194._12_4_ * auVar140._12_4_;
        auVar120._16_4_ = auVar194._16_4_ * auVar140._16_4_;
        auVar120._20_4_ = auVar194._20_4_ * auVar140._20_4_;
        auVar120._24_4_ = auVar194._24_4_ * auVar140._24_4_;
        auVar120._28_4_ = 0;
        auVar8 = vfmsub231ps_fma(auVar120,auVar188,auVar198);
        auVar49._4_4_ = auVar190._4_4_ * auVar198._4_4_;
        auVar49._0_4_ = auVar190._0_4_ * auVar198._0_4_;
        auVar49._8_4_ = auVar190._8_4_ * auVar198._8_4_;
        auVar49._12_4_ = auVar190._12_4_ * auVar198._12_4_;
        auVar49._16_4_ = auVar190._16_4_ * auVar198._16_4_;
        auVar49._20_4_ = auVar190._20_4_ * auVar198._20_4_;
        auVar49._24_4_ = auVar190._24_4_ * auVar198._24_4_;
        auVar49._28_4_ = auVar198._28_4_;
        auVar11 = vfmsub231ps_fma(auVar49,auVar213,auVar194);
        auVar50._4_4_ = auVar188._4_4_ * auVar213._4_4_;
        auVar50._0_4_ = auVar188._0_4_ * auVar213._0_4_;
        auVar50._8_4_ = auVar188._8_4_ * auVar213._8_4_;
        auVar50._12_4_ = auVar188._12_4_ * auVar213._12_4_;
        auVar50._16_4_ = auVar188._16_4_ * auVar213._16_4_;
        auVar50._20_4_ = auVar188._20_4_ * auVar213._20_4_;
        auVar50._24_4_ = auVar188._24_4_ * auVar213._24_4_;
        auVar50._28_4_ = auVar213._28_4_;
        auVar12 = vfmsub231ps_fma(auVar50,auVar190,auVar140);
        auVar213 = ZEXT832(0) << 0x20;
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar213,ZEXT1632(auVar8));
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar213,ZEXT1632(auVar11));
        auVar140 = vmaxps_avx(ZEXT1632(auVar10),ZEXT1632(auVar11));
        auVar140 = vcmpps_avx(auVar140,ZEXT832(0) << 0x20,2);
        auVar8 = vpackssdw_avx(auVar140._0_16_,auVar140._16_16_);
        auVar166 = vpand_avx(auVar166,auVar8);
        auVar140 = vpmovsxwd_avx2(auVar166);
        if ((((((((auVar140 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar140 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar140 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar140 >> 0x7f,0) == '\0') &&
              (auVar140 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar140 >> 0xbf,0) == '\0') &&
            (auVar140 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar140[0x1f]) {
LAB_01859c63:
          auVar185 = ZEXT3264(CONCAT824(uStack_5c8,
                                        CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
          auVar199 = ZEXT3264(CONCAT428(local_720,
                                        CONCAT424(local_720,
                                                  CONCAT420(local_720,
                                                            CONCAT416(local_720,
                                                                      CONCAT412(local_720,
                                                                                CONCAT48(local_720,
                                                                                         CONCAT44(
                                                  local_720,local_720))))))));
        }
        else {
          auVar51._4_4_ = auVar134._4_4_ * auVar194._4_4_;
          auVar51._0_4_ = auVar134._0_4_ * auVar194._0_4_;
          auVar51._8_4_ = auVar134._8_4_ * auVar194._8_4_;
          auVar51._12_4_ = auVar134._12_4_ * auVar194._12_4_;
          auVar51._16_4_ = auVar134._16_4_ * auVar194._16_4_;
          auVar51._20_4_ = auVar134._20_4_ * auVar194._20_4_;
          auVar51._24_4_ = auVar134._24_4_ * auVar194._24_4_;
          auVar51._28_4_ = auVar140._28_4_;
          auVar112 = vfmsub231ps_fma(auVar51,auVar190,auVar151);
          auVar138._0_4_ = auVar188._0_4_ * auVar151._0_4_;
          auVar138._4_4_ = auVar188._4_4_ * auVar151._4_4_;
          auVar138._8_4_ = auVar188._8_4_ * auVar151._8_4_;
          auVar138._12_4_ = auVar188._12_4_ * auVar151._12_4_;
          auVar138._16_4_ = auVar188._16_4_ * auVar151._16_4_;
          auVar138._20_4_ = auVar188._20_4_ * auVar151._20_4_;
          auVar138._24_4_ = auVar188._24_4_ * auVar151._24_4_;
          auVar138._28_4_ = 0;
          auVar13 = vfmsub231ps_fma(auVar138,auVar135,auVar194);
          auVar52._4_4_ = auVar135._4_4_ * auVar190._4_4_;
          auVar52._0_4_ = auVar135._0_4_ * auVar190._0_4_;
          auVar52._8_4_ = auVar135._8_4_ * auVar190._8_4_;
          auVar52._12_4_ = auVar135._12_4_ * auVar190._12_4_;
          auVar52._16_4_ = auVar135._16_4_ * auVar190._16_4_;
          auVar52._20_4_ = auVar135._20_4_ * auVar190._20_4_;
          auVar52._24_4_ = auVar135._24_4_ * auVar190._24_4_;
          auVar52._28_4_ = auVar135._28_4_;
          auVar178 = vfmsub231ps_fma(auVar52,auVar188,auVar134);
          auVar8 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar13),ZEXT1632(auVar178));
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT1632(auVar112),auVar213);
          auVar140 = vrcpps_avx(ZEXT1632(auVar12));
          auVar211._8_4_ = 0x3f800000;
          auVar211._0_8_ = &DAT_3f8000003f800000;
          auVar211._12_4_ = 0x3f800000;
          auVar211._16_4_ = 0x3f800000;
          auVar211._20_4_ = 0x3f800000;
          auVar211._24_4_ = 0x3f800000;
          auVar211._28_4_ = 0x3f800000;
          auVar8 = vfnmadd213ps_fma(auVar140,ZEXT1632(auVar12),auVar211);
          auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar140,auVar140);
          auVar53._4_4_ = auVar178._4_4_ * auVar122._4_4_;
          auVar53._0_4_ = auVar178._0_4_ * auVar122._0_4_;
          auVar53._8_4_ = auVar178._8_4_ * auVar122._8_4_;
          auVar53._12_4_ = auVar178._12_4_ * auVar122._12_4_;
          auVar53._16_4_ = auVar122._16_4_ * 0.0;
          auVar53._20_4_ = auVar122._20_4_ * 0.0;
          auVar53._24_4_ = auVar122._24_4_ * 0.0;
          auVar53._28_4_ = auVar122._28_4_;
          auVar13 = vfmadd231ps_fma(auVar53,auVar125,ZEXT1632(auVar13));
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT1632(auVar112),auVar115);
          fVar145 = auVar8._0_4_;
          fVar126 = auVar8._4_4_;
          fVar127 = auVar8._8_4_;
          fVar128 = auVar8._12_4_;
          auVar54._28_4_ = auVar125._28_4_;
          auVar54._0_28_ =
               ZEXT1628(CONCAT412(fVar128 * auVar13._12_4_,
                                  CONCAT48(fVar127 * auVar13._8_4_,
                                           CONCAT44(fVar126 * auVar13._4_4_,fVar145 * auVar13._0_4_)
                                          )));
          auVar121._4_4_ = uVar102;
          auVar121._0_4_ = uVar102;
          auVar121._8_4_ = uVar102;
          auVar121._12_4_ = uVar102;
          auVar121._16_4_ = uVar102;
          auVar121._20_4_ = uVar102;
          auVar121._24_4_ = uVar102;
          auVar121._28_4_ = uVar102;
          uVar5 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar139._4_4_ = uVar5;
          auVar139._0_4_ = uVar5;
          auVar139._8_4_ = uVar5;
          auVar139._12_4_ = uVar5;
          auVar139._16_4_ = uVar5;
          auVar139._20_4_ = uVar5;
          auVar139._24_4_ = uVar5;
          auVar139._28_4_ = uVar5;
          auVar115 = vcmpps_avx(auVar121,auVar54,2);
          auVar125 = vcmpps_avx(auVar54,auVar139,2);
          auVar115 = vandps_avx(auVar125,auVar115);
          auVar8 = vpackssdw_avx(auVar115._0_16_,auVar115._16_16_);
          auVar166 = vpand_avx(auVar166,auVar8);
          auVar115 = vpmovsxwd_avx2(auVar166);
          if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar115 >> 0x7f,0) == '\0') &&
                (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar115 >> 0xbf,0) == '\0') &&
              (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar115[0x1f]) goto LAB_01859c63;
          auVar115 = vcmpps_avx(auVar213,ZEXT1632(auVar12),4);
          auVar8 = vpackssdw_avx(auVar115._0_16_,auVar115._16_16_);
          auVar166 = vpand_avx(auVar166,auVar8);
          auVar115 = vpmovsxwd_avx2(auVar166);
          auVar185 = ZEXT3264(CONCAT824(uStack_5c8,
                                        CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
          auVar199 = ZEXT3264(CONCAT428(local_720,
                                        CONCAT424(local_720,
                                                  CONCAT420(local_720,
                                                            CONCAT416(local_720,
                                                                      CONCAT412(local_720,
                                                                                CONCAT48(local_720,
                                                                                         CONCAT44(
                                                  local_720,local_720))))))));
          if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar115 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar115 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar115 >> 0x7f,0) != '\0') ||
                (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar115 >> 0xbf,0) != '\0') ||
              (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar115[0x1f] < '\0') {
            auVar122 = ZEXT1632(CONCAT412(fVar128 * auVar10._12_4_,
                                          CONCAT48(fVar127 * auVar10._8_4_,
                                                   CONCAT44(fVar126 * auVar10._4_4_,
                                                            fVar145 * auVar10._0_4_))));
            auVar140 = ZEXT1632(CONCAT412(fVar128 * auVar11._12_4_,
                                          CONCAT48(fVar127 * auVar11._8_4_,
                                                   CONCAT44(fVar126 * auVar11._4_4_,
                                                            fVar145 * auVar11._0_4_))));
            auVar172._8_4_ = 0x3f800000;
            auVar172._0_8_ = &DAT_3f8000003f800000;
            auVar172._12_4_ = 0x3f800000;
            auVar172._16_4_ = 0x3f800000;
            auVar172._20_4_ = 0x3f800000;
            auVar172._24_4_ = 0x3f800000;
            auVar172._28_4_ = 0x3f800000;
            auVar125 = vsubps_avx(auVar172,auVar122);
            local_120 = vblendvps_avx(auVar125,auVar122,auVar116);
            auVar125 = vsubps_avx(auVar172,auVar140);
            local_4e0 = vblendvps_avx(auVar125,auVar140,auVar116);
            auVar185 = ZEXT3264(auVar115);
            local_2c0 = auVar54;
          }
        }
        auVar208 = ZEXT3264(auVar159);
        auVar215 = ZEXT3264(_local_7a0);
        auVar163 = ZEXT3264(auVar181);
        auVar115 = auVar185._0_32_;
        if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar115 >> 0x7f,0) == '\0') &&
              (auVar185 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar115 >> 0xbf,0) == '\0') &&
            (auVar185 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar185[0x1f]) {
          local_800._0_4_ = 0;
          auVar143 = ZEXT3264(CONCAT428(fVar164,CONCAT424(fVar158,CONCAT420(fVar164,CONCAT416(
                                                  fVar158,CONCAT412(fVar164,CONCAT48(fVar158,uVar111
                                                                                    )))))));
        }
        else {
          auVar125 = vsubps_avx(auVar189,auVar217);
          auVar166 = vfmadd213ps_fma(auVar125,local_120,auVar217);
          fVar145 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
          auVar55._4_4_ = (auVar166._4_4_ + auVar166._4_4_) * fVar145;
          auVar55._0_4_ = (auVar166._0_4_ + auVar166._0_4_) * fVar145;
          auVar55._8_4_ = (auVar166._8_4_ + auVar166._8_4_) * fVar145;
          auVar55._12_4_ = (auVar166._12_4_ + auVar166._12_4_) * fVar145;
          auVar55._16_4_ = fVar145 * 0.0;
          auVar55._20_4_ = fVar145 * 0.0;
          auVar55._24_4_ = fVar145 * 0.0;
          auVar55._28_4_ = 0;
          auVar125 = vcmpps_avx(local_2c0,auVar55,6);
          auVar122 = auVar115 & auVar125;
          if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar122 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar122 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar122 >> 0x7f,0) != '\0') ||
                (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar122 >> 0xbf,0) != '\0') ||
              (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar122[0x1f] < '\0') {
            local_3c0 = vandps_avx(auVar125,auVar115);
            auVar141._8_4_ = 0xbf800000;
            auVar141._0_8_ = 0xbf800000bf800000;
            auVar141._12_4_ = 0xbf800000;
            auVar141._16_4_ = 0xbf800000;
            auVar141._20_4_ = 0xbf800000;
            auVar141._24_4_ = 0xbf800000;
            auVar141._28_4_ = 0xbf800000;
            auVar153._8_4_ = 0x40000000;
            auVar153._0_8_ = 0x4000000040000000;
            auVar153._12_4_ = 0x40000000;
            auVar153._16_4_ = 0x40000000;
            auVar153._20_4_ = 0x40000000;
            auVar153._24_4_ = 0x40000000;
            auVar153._28_4_ = 0x40000000;
            auVar166 = vfmadd213ps_fma(local_4e0,auVar153,auVar141);
            local_480 = local_120;
            local_460 = ZEXT1632(auVar166);
            local_440 = local_2c0;
            local_420 = 0;
            local_400 = local_5f0._0_8_;
            uStack_3f8 = local_5f0._8_8_;
            local_3f0 = local_600._0_8_;
            uStack_3e8 = local_600._8_8_;
            local_3e0 = local_610._0_8_;
            uStack_3d8 = local_610._8_8_;
            local_4e0 = local_460;
            if ((pGVar15->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              auVar143 = ZEXT3264(CONCAT428(fVar164,CONCAT424(fVar158,CONCAT420(fVar164,CONCAT416(
                                                  fVar158,CONCAT412(fVar164,CONCAT48(fVar158,uVar111
                                                                                    )))))));
              if (context->args->filter == (RTCFilterFunctionN)0x0) {
                auVar185 = ZEXT3264(auVar181);
                local_800._0_4_ = 1;
                if (pGVar15->occlusionFilterN == (RTCFilterFunctionN)0x0) goto LAB_018587b0;
              }
              fVar145 = 1.0 / auVar118._0_4_;
              local_3a0[0] = fVar145 * (local_120._0_4_ + 0.0);
              local_3a0[1] = fVar145 * (local_120._4_4_ + 1.0);
              local_3a0[2] = fVar145 * (local_120._8_4_ + 2.0);
              local_3a0[3] = fVar145 * (local_120._12_4_ + 3.0);
              fStack_390 = fVar145 * (local_120._16_4_ + 4.0);
              fStack_38c = fVar145 * (local_120._20_4_ + 5.0);
              fStack_388 = fVar145 * (local_120._24_4_ + 6.0);
              fStack_384 = local_120._28_4_ + 7.0;
              local_4e0._0_8_ = auVar166._0_8_;
              local_4e0._8_8_ = auVar166._8_8_;
              local_380 = local_4e0._0_8_;
              uStack_378 = local_4e0._8_8_;
              uStack_370 = 0;
              uStack_368 = 0;
              local_360 = local_2c0._0_8_;
              uStack_358 = local_2c0._8_8_;
              uStack_350 = local_2c0._16_8_;
              uStack_348 = local_2c0._24_8_;
              uVar102 = vmovmskps_avx(local_3c0);
              local_800 = ZEXT1632(CONCAT124(auVar9._4_12_,(uint)(uVar102 != 0)));
              if (uVar102 == 0) {
                auVar143 = ZEXT3264(CONCAT428(fVar164,CONCAT424(fVar158,CONCAT420(fVar164,CONCAT416(
                                                  fVar158,CONCAT412(fVar164,CONCAT48(fVar158,uVar111
                                                                                    )))))));
              }
              else {
                uVar103 = 0;
                uVar105 = (ulong)(uVar102 & 0xff);
                for (uVar22 = uVar105; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000)
                {
                  uVar103 = uVar103 + 1;
                }
                local_700._4_4_ = uVar104;
                local_700._0_4_ = uVar104;
                local_700._8_4_ = uVar104;
                local_700._12_4_ = uVar104;
                local_700._16_4_ = uVar104;
                local_700._20_4_ = uVar104;
                local_700._24_4_ = uVar104;
                local_700._28_4_ = uVar104;
                local_6a0._0_4_ = local_6a0._4_4_;
                local_6a0._8_4_ = local_6a0._4_4_;
                local_6a0._12_4_ = local_6a0._4_4_;
                local_6a0._16_4_ = local_6a0._4_4_;
                local_6a0._20_4_ = local_6a0._4_4_;
                local_6a0._24_4_ = local_6a0._4_4_;
                local_6a0._28_4_ = local_6a0._4_4_;
                local_6c0 = ZEXT1632(local_5f0);
                auStack_6d0 = auVar19._16_16_;
                _local_6e0 = local_600;
                auStack_570 = auVar124._16_16_;
                _local_580 = local_610;
                local_760 = auVar181;
                local_740 = auVar159;
                local_41c = iVar101;
                local_410 = uVar177;
                uStack_408 = uVar92;
                do {
                  auVar125 = local_800;
                  uVar5 = *(undefined4 *)(ray + k * 4 + 0x100);
                  fVar145 = local_3a0[uVar103];
                  auVar113._4_4_ = fVar145;
                  auVar113._0_4_ = fVar145;
                  auVar113._8_4_ = fVar145;
                  auVar113._12_4_ = fVar145;
                  local_240._16_4_ = fVar145;
                  local_240._0_16_ = auVar113;
                  local_240._20_4_ = fVar145;
                  local_240._24_4_ = fVar145;
                  local_240._28_4_ = fVar145;
                  uVar4 = *(undefined4 *)((long)&local_380 + uVar103 * 4);
                  local_220._4_4_ = uVar4;
                  local_220._0_4_ = uVar4;
                  local_220._8_4_ = uVar4;
                  local_220._12_4_ = uVar4;
                  local_220._16_4_ = uVar4;
                  local_220._20_4_ = uVar4;
                  local_220._24_4_ = uVar4;
                  local_220._28_4_ = uVar4;
                  *(undefined4 *)(ray + k * 4 + 0x100) =
                       *(undefined4 *)((long)&local_360 + uVar103 * 4);
                  fVar127 = 1.0 - fVar145;
                  auVar166 = ZEXT416((uint)(fVar145 * fVar127 * 4.0));
                  auVar8 = vfnmsub213ss_fma(auVar113,auVar113,auVar166);
                  auVar166 = vfmadd213ss_fma(ZEXT416((uint)fVar127),ZEXT416((uint)fVar127),auVar166)
                  ;
                  fVar126 = auVar166._0_4_ * 0.5;
                  fVar145 = fVar145 * fVar145 * 0.5;
                  auVar167._0_4_ = fVar145 * (float)local_580._0_4_;
                  auVar167._4_4_ = fVar145 * (float)local_580._4_4_;
                  auVar167._8_4_ = fVar145 * fStack_578;
                  auVar167._12_4_ = fVar145 * fStack_574;
                  auVar147._4_4_ = fVar126;
                  auVar147._0_4_ = fVar126;
                  auVar147._8_4_ = fVar126;
                  auVar147._12_4_ = fVar126;
                  auVar166 = vfmadd132ps_fma(auVar147,auVar167,_local_6e0);
                  fVar145 = auVar8._0_4_ * 0.5;
                  auVar168._4_4_ = fVar145;
                  auVar168._0_4_ = fVar145;
                  auVar168._8_4_ = fVar145;
                  auVar168._12_4_ = fVar145;
                  auVar166 = vfmadd132ps_fma(auVar168,auVar166,local_6c0._0_16_);
                  local_7d0.context = context->user;
                  fVar145 = fVar127 * -fVar127 * 0.5;
                  auVar148._4_4_ = fVar145;
                  auVar148._0_4_ = fVar145;
                  auVar148._8_4_ = fVar145;
                  auVar148._12_4_ = fVar145;
                  auVar8 = vfmadd132ps_fma(auVar148,auVar166,auVar169);
                  local_2a0 = auVar8._0_4_;
                  uStack_29c = local_2a0;
                  uStack_298 = local_2a0;
                  uStack_294 = local_2a0;
                  uStack_290 = local_2a0;
                  uStack_28c = local_2a0;
                  uStack_288 = local_2a0;
                  uStack_284 = local_2a0;
                  auVar166 = vmovshdup_avx(auVar8);
                  local_280 = auVar166._0_8_;
                  uStack_278 = local_280;
                  uStack_270 = local_280;
                  uStack_268 = local_280;
                  auVar166 = vshufps_avx(auVar8,auVar8,0xaa);
                  local_260 = auVar166._0_8_;
                  uStack_258 = local_260;
                  uStack_250 = local_260;
                  uStack_248 = local_260;
                  local_200 = local_6a0._0_8_;
                  uStack_1f8 = local_6a0._8_8_;
                  uStack_1f0 = local_6a0._16_8_;
                  uStack_1e8 = local_6a0._24_8_;
                  local_1e0 = local_700;
                  auVar115 = vpcmpeqd_avx2(local_220,local_220);
                  local_1c0 = (local_7d0.context)->instID[0];
                  uStack_1bc = local_1c0;
                  uStack_1b8 = local_1c0;
                  uStack_1b4 = local_1c0;
                  uStack_1b0 = local_1c0;
                  uStack_1ac = local_1c0;
                  uStack_1a8 = local_1c0;
                  uStack_1a4 = local_1c0;
                  local_1a0 = (local_7d0.context)->instPrimID[0];
                  uStack_19c = local_1a0;
                  uStack_198 = local_1a0;
                  uStack_194 = local_1a0;
                  uStack_190 = local_1a0;
                  uStack_18c = local_1a0;
                  uStack_188 = local_1a0;
                  uStack_184 = local_1a0;
                  local_640 = local_300._0_8_;
                  uStack_638 = local_300._8_8_;
                  uStack_630 = local_300._16_8_;
                  uStack_628 = local_300._24_8_;
                  local_7d0.valid = (int *)&local_640;
                  local_7d0.geometryUserPtr = *(void **)(CONCAT44(uStack_5bc,local_5c0) + 0x18);
                  local_7d0.hit = (RTCHitN *)&local_2a0;
                  local_7d0.N = 8;
                  pcVar16 = *(code **)(CONCAT44(uStack_5bc,local_5c0) + 0x48);
                  local_7d0.ray = (RTCRayN *)ray;
                  if (pcVar16 != (code *)0x0) {
                    (*pcVar16)(&local_7d0);
                    auVar143._8_56_ = extraout_var;
                    auVar143._0_8_ = extraout_XMM1_Qa;
                    auVar215 = ZEXT3264(_local_7a0);
                    auVar163 = ZEXT3264(local_760);
                    auVar208 = ZEXT3264(local_740);
                    auVar199 = ZEXT3264(CONCAT428(fStack_704,
                                                  CONCAT424(fStack_708,
                                                            CONCAT420(fStack_70c,
                                                                      CONCAT416(fStack_710,
                                                                                CONCAT412(fStack_714
                                                                                          ,CONCAT48(
                                                  fStack_718,CONCAT44(fStack_71c,local_720))))))));
                    auVar115 = vpcmpeqd_avx2(auVar143._0_32_,auVar143._0_32_);
                  }
                  auVar93._8_8_ = uStack_638;
                  auVar93._0_8_ = local_640;
                  auVar93._16_8_ = uStack_630;
                  auVar93._24_8_ = uStack_628;
                  auVar140 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar93);
                  auVar122 = auVar115 & ~auVar140;
                  if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar122 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar122 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar122 >> 0x7f,0) == '\0') &&
                        (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar122 >> 0xbf,0) == '\0') &&
                      (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar122[0x1f]) {
                    auVar140 = auVar140 ^ auVar115;
                  }
                  else {
                    p_Var17 = context->args->filter;
                    if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(CONCAT44(uStack_5bc,local_5c0) + 0x3e) & 0x40) != 0)))) {
                      (*p_Var17)(&local_7d0);
                      auVar215 = ZEXT3264(_local_7a0);
                      auVar163 = ZEXT3264(local_760);
                      auVar208 = ZEXT3264(local_740);
                      auVar199 = ZEXT3264(CONCAT428(fStack_704,
                                                    CONCAT424(fStack_708,
                                                              CONCAT420(fStack_70c,
                                                                        CONCAT416(fStack_710,
                                                                                  CONCAT412(
                                                  fStack_714,
                                                  CONCAT48(fStack_718,CONCAT44(fStack_71c,local_720)
                                                          )))))));
                    }
                    auVar94._8_8_ = uStack_638;
                    auVar94._0_8_ = local_640;
                    auVar94._16_8_ = uStack_630;
                    auVar94._24_8_ = uStack_628;
                    auVar122 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                    auVar115 = vpcmpeqd_avx2(auVar122,auVar94);
                    auVar140 = vpcmpeqd_avx2(auVar122,auVar122);
                    auVar140 = auVar115 ^ auVar140;
                    auVar154._8_4_ = 0xff800000;
                    auVar154._0_8_ = 0xff800000ff800000;
                    auVar154._12_4_ = 0xff800000;
                    auVar154._16_4_ = 0xff800000;
                    auVar154._20_4_ = 0xff800000;
                    auVar154._24_4_ = 0xff800000;
                    auVar154._28_4_ = 0xff800000;
                    auVar115 = vblendvps_avx(auVar154,*(undefined1 (*) [32])(local_7d0.ray + 0x100),
                                             auVar115);
                    *(undefined1 (*) [32])(local_7d0.ray + 0x100) = auVar115;
                  }
                  auVar159 = auVar208._0_32_;
                  auVar181 = auVar163._0_32_;
                  auVar143 = ZEXT3264(CONCAT428(fVar164,CONCAT424(fVar158,CONCAT420(fVar164,
                                                  CONCAT416(fVar158,CONCAT412(fVar164,CONCAT48(
                                                  fVar158,uVar111)))))));
                  if ((((((((auVar140 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar140 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar140 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar140 >> 0x7f,0) != '\0') ||
                        (auVar140 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar140 >> 0xbf,0) != '\0') ||
                      (auVar140 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar140[0x1f] < '\0') break;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar5;
                  uVar22 = uVar103 & 0x3f;
                  uVar103 = 0;
                  uVar105 = uVar105 ^ 1L << uVar22;
                  for (uVar22 = uVar105; (uVar22 & 1) == 0;
                      uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                    uVar103 = uVar103 + 1;
                  }
                  local_800._1_3_ = 0;
                  local_800[0] = uVar105 != 0;
                  local_800._4_28_ = auVar125._4_28_;
                } while (uVar105 != 0);
              }
              goto LAB_018587ac;
            }
          }
          local_800._0_4_ = 0;
          auVar143 = ZEXT3264(CONCAT428(fVar164,CONCAT424(fVar158,CONCAT420(fVar164,CONCAT416(
                                                  fVar158,CONCAT412(fVar164,CONCAT48(fVar158,uVar111
                                                                                    )))))));
        }
LAB_018587ac:
        auVar185 = ZEXT3264(auVar181);
      }
LAB_018587b0:
      auVar208 = ZEXT3264(auVar210);
      auVar163 = ZEXT3264(local_680);
      if (8 < iVar101) {
        local_760 = auVar185._0_32_;
        local_580._4_4_ = iVar101;
        local_580._0_4_ = iVar101;
        fStack_578 = (float)iVar101;
        fStack_574 = (float)iVar101;
        auStack_570._0_4_ = iVar101;
        auStack_570._4_4_ = iVar101;
        auStack_570._8_4_ = iVar101;
        auStack_570._12_4_ = iVar101;
        local_4c0._4_4_ = fVar146;
        local_4c0._0_4_ = fVar146;
        fStack_4b8 = fVar146;
        fStack_4b4 = fVar146;
        fStack_4b0 = fVar146;
        fStack_4ac = fVar146;
        fStack_4a8 = fVar146;
        fStack_4a4 = fVar146;
        local_5c0 = local_780._0_4_;
        uStack_5bc = local_780._0_4_;
        uStack_5b8 = local_780._0_4_;
        uStack_5b4 = local_780._0_4_;
        uStack_5b0 = local_780._0_4_;
        uStack_5ac = local_780._0_4_;
        uStack_5a8 = local_780._0_4_;
        uStack_5a4 = local_780._0_4_;
        local_180 = 1.0 / (float)local_540._0_4_;
        fStack_17c = local_180;
        fStack_178 = local_180;
        fStack_174 = local_180;
        fStack_170 = local_180;
        fStack_16c = local_180;
        fStack_168 = local_180;
        fStack_164 = local_180;
        local_140 = uVar104;
        uStack_13c = uVar104;
        uStack_138 = uVar104;
        uStack_134 = uVar104;
        uStack_130 = uVar104;
        uStack_12c = uVar104;
        uStack_128 = uVar104;
        uStack_124 = uVar104;
        local_160 = local_560._0_4_;
        uStack_15c = local_560._0_4_;
        uStack_158 = local_560._0_4_;
        uStack_154 = local_560._0_4_;
        uStack_150 = local_560._0_4_;
        uStack_14c = local_560._0_4_;
        uStack_148 = local_560._0_4_;
        uStack_144 = local_560._0_4_;
        lVar107 = 8;
        _local_7a0 = auVar215._0_32_;
        local_740 = auVar159;
        do {
          auVar115 = *(undefined1 (*) [32])(bspline_basis0 + lVar107 * 4 + lVar20);
          auVar125 = *(undefined1 (*) [32])(lVar20 + 0x222bfac + lVar107 * 4);
          local_780 = *(undefined1 (*) [32])(lVar20 + 0x222c430 + lVar107 * 4);
          pauVar2 = (undefined1 (*) [28])(lVar20 + 0x222c8b4 + lVar107 * 4);
          auVar98 = *pauVar2;
          fVar132 = auVar199._0_4_;
          auVar216._0_4_ = fVar132 * *(float *)*pauVar2;
          fVar144 = auVar199._4_4_;
          auVar216._4_4_ = fVar144 * *(float *)(*pauVar2 + 4);
          fVar201 = auVar199._8_4_;
          auVar216._8_4_ = fVar201 * *(float *)(*pauVar2 + 8);
          fVar202 = auVar199._12_4_;
          auVar216._12_4_ = fVar202 * *(float *)(*pauVar2 + 0xc);
          fVar203 = auVar199._16_4_;
          auVar216._16_4_ = fVar203 * *(float *)(*pauVar2 + 0x10);
          fVar204 = auVar199._20_4_;
          auVar216._20_4_ = fVar204 * *(float *)(*pauVar2 + 0x14);
          fVar205 = auVar199._24_4_;
          auVar216._28_36_ = auVar215._28_36_;
          auVar216._24_4_ = fVar205 * *(float *)(*pauVar2 + 0x18);
          auVar56._4_4_ = auVar143._4_4_ * *(float *)(*pauVar2 + 4);
          auVar56._0_4_ = auVar143._0_4_ * *(float *)*pauVar2;
          auVar56._8_4_ = auVar143._8_4_ * *(float *)(*pauVar2 + 8);
          auVar56._12_4_ = auVar143._12_4_ * *(float *)(*pauVar2 + 0xc);
          auVar56._16_4_ = auVar143._16_4_ * *(float *)(*pauVar2 + 0x10);
          auVar56._20_4_ = auVar143._20_4_ * *(float *)(*pauVar2 + 0x14);
          auVar56._24_4_ = auVar143._24_4_ * *(float *)(*pauVar2 + 0x18);
          auVar56._28_4_ = *(undefined4 *)pauVar2[1];
          auVar169 = vfmadd231ps_fma(auVar216._0_32_,local_780,auVar163._0_32_);
          auVar151 = auVar208._0_32_;
          auVar166 = vfmadd231ps_fma(auVar56,local_780,auVar151);
          auVar169 = vfmadd231ps_fma(ZEXT1632(auVar169),auVar125,auVar220);
          auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar125,local_520);
          auVar169 = vfmadd231ps_fma(ZEXT1632(auVar169),auVar115,auVar195);
          auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar115,local_5a0);
          auVar122 = *(undefined1 (*) [32])(bspline_basis1 + lVar107 * 4 + lVar20);
          auVar140 = *(undefined1 (*) [32])(lVar20 + 0x222e3cc + lVar107 * 4);
          auVar213 = *(undefined1 (*) [32])(lVar20 + 0x222e850 + lVar107 * 4);
          pauVar2 = (undefined1 (*) [28])(lVar20 + 0x222ecd4 + lVar107 * 4);
          fVar131 = *(float *)*pauVar2;
          fVar86 = *(float *)(*pauVar2 + 4);
          fVar87 = *(float *)(*pauVar2 + 8);
          fVar88 = *(float *)(*pauVar2 + 0xc);
          fVar89 = *(float *)(*pauVar2 + 0x10);
          fVar90 = *(float *)(*pauVar2 + 0x14);
          fVar91 = *(float *)(*pauVar2 + 0x18);
          auVar99 = *pauVar2;
          auVar208._0_4_ = fVar132 * fVar131;
          auVar208._4_4_ = fVar144 * fVar86;
          auVar208._8_4_ = fVar201 * fVar87;
          auVar208._12_4_ = fVar202 * fVar88;
          auVar208._16_4_ = fVar203 * fVar89;
          auVar208._20_4_ = fVar204 * fVar90;
          auVar208._28_36_ = auVar185._28_36_;
          auVar208._24_4_ = fVar205 * fVar91;
          auVar57._4_4_ = fVar86 * auVar143._4_4_;
          auVar57._0_4_ = fVar131 * auVar143._0_4_;
          auVar57._8_4_ = fVar87 * auVar143._8_4_;
          auVar57._12_4_ = fVar88 * auVar143._12_4_;
          auVar57._16_4_ = fVar89 * auVar143._16_4_;
          auVar57._20_4_ = fVar90 * auVar143._20_4_;
          auVar57._24_4_ = fVar91 * auVar143._24_4_;
          auVar57._28_4_ = auVar115._28_4_;
          auVar8 = vfmadd231ps_fma(auVar208._0_32_,auVar213,auVar163._0_32_);
          auVar9 = vfmadd231ps_fma(auVar57,auVar213,auVar151);
          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar140,auVar220);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar140,local_520);
          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar122,auVar195);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar122,local_5a0);
          auVar135 = ZEXT1632(auVar8);
          auVar188 = ZEXT1632(auVar169);
          auVar192 = vsubps_avx(auVar135,auVar188);
          auVar155 = ZEXT1632(auVar9);
          auVar116 = ZEXT1632(auVar166);
          local_540 = vsubps_avx(auVar155,auVar116);
          auVar85._4_4_ = auVar192._4_4_ * auVar166._4_4_;
          auVar85._0_4_ = auVar192._0_4_ * auVar166._0_4_;
          auVar85._8_4_ = auVar192._8_4_ * auVar166._8_4_;
          auVar85._12_4_ = auVar192._12_4_ * auVar166._12_4_;
          auVar85._16_4_ = auVar192._16_4_ * 0.0;
          auVar85._20_4_ = auVar192._20_4_ * 0.0;
          auVar85._24_4_ = auVar192._24_4_ * 0.0;
          auVar85._28_4_ = local_520._28_4_;
          fVar146 = local_540._0_4_;
          auVar163._0_4_ = auVar169._0_4_ * fVar146;
          fVar145 = local_540._4_4_;
          auVar163._4_4_ = auVar169._4_4_ * fVar145;
          fVar126 = local_540._8_4_;
          auVar163._8_4_ = auVar169._8_4_ * fVar126;
          fVar127 = local_540._12_4_;
          auVar163._12_4_ = auVar169._12_4_ * fVar127;
          fVar128 = local_540._16_4_;
          auVar163._16_4_ = fVar128 * 0.0;
          fVar129 = local_540._20_4_;
          auVar163._20_4_ = fVar129 * 0.0;
          fVar130 = local_540._24_4_;
          auVar163._28_36_ = auVar143._28_36_;
          auVar163._24_4_ = fVar130 * 0.0;
          auVar124 = vsubps_avx(auVar85,auVar163._0_32_);
          auVar215 = ZEXT3264(auVar124);
          local_920._0_4_ = auVar98._0_4_;
          local_920._4_4_ = auVar98._4_4_;
          fStack_918 = auVar98._8_4_;
          fStack_914 = auVar98._12_4_;
          fStack_910 = auVar98._16_4_;
          fStack_90c = auVar98._20_4_;
          fStack_908 = auVar98._24_4_;
          auVar182._0_4_ = (float)local_100 * (float)local_920;
          auVar182._4_4_ = local_100._4_4_ * local_920._4_4_;
          auVar182._8_4_ = (float)uStack_f8 * fStack_918;
          auVar182._12_4_ = uStack_f8._4_4_ * fStack_914;
          auVar182._16_4_ = (float)uStack_f0 * fStack_910;
          auVar182._20_4_ = uStack_f0._4_4_ * fStack_90c;
          auVar182._24_4_ = (float)uStack_e8 * fStack_908;
          auVar182._28_4_ = 0;
          auVar169 = vfmadd231ps_fma(auVar182,local_780,local_e0);
          auVar169 = vfmadd231ps_fma(ZEXT1632(auVar169),local_c0,auVar125);
          auVar169 = vfmadd231ps_fma(ZEXT1632(auVar169),local_a0,auVar115);
          auVar185 = ZEXT1664(auVar169);
          auVar58._4_4_ = fVar86 * local_100._4_4_;
          auVar58._0_4_ = fVar131 * (float)local_100;
          auVar58._8_4_ = fVar87 * (float)uStack_f8;
          auVar58._12_4_ = fVar88 * uStack_f8._4_4_;
          auVar58._16_4_ = fVar89 * (float)uStack_f0;
          auVar58._20_4_ = fVar90 * uStack_f0._4_4_;
          auVar58._24_4_ = fVar91 * (float)uStack_e8;
          auVar58._28_4_ = uStack_e8._4_4_;
          auVar166 = vfmadd231ps_fma(auVar58,auVar213,local_e0);
          auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar140,local_c0);
          auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar122,local_a0);
          auVar200._0_4_ = fVar146 * fVar146;
          auVar200._4_4_ = fVar145 * fVar145;
          auVar200._8_4_ = fVar126 * fVar126;
          auVar200._12_4_ = fVar127 * fVar127;
          auVar200._16_4_ = fVar128 * fVar128;
          auVar200._20_4_ = fVar129 * fVar129;
          auVar200._28_36_ = auVar199._28_36_;
          auVar200._24_4_ = fVar130 * fVar130;
          auVar8 = vfmadd231ps_fma(auVar200._0_32_,auVar192,auVar192);
          auVar198 = vmaxps_avx(ZEXT1632(auVar169),ZEXT1632(auVar166));
          auVar196._0_4_ = auVar198._0_4_ * auVar198._0_4_ * auVar8._0_4_;
          auVar196._4_4_ = auVar198._4_4_ * auVar198._4_4_ * auVar8._4_4_;
          auVar196._8_4_ = auVar198._8_4_ * auVar198._8_4_ * auVar8._8_4_;
          auVar196._12_4_ = auVar198._12_4_ * auVar198._12_4_ * auVar8._12_4_;
          auVar196._16_4_ = auVar198._16_4_ * auVar198._16_4_ * 0.0;
          auVar196._20_4_ = auVar198._20_4_ * auVar198._20_4_ * 0.0;
          auVar196._24_4_ = auVar198._24_4_ * auVar198._24_4_ * 0.0;
          auVar196._28_4_ = 0;
          auVar59._4_4_ = auVar124._4_4_ * auVar124._4_4_;
          auVar59._0_4_ = auVar124._0_4_ * auVar124._0_4_;
          auVar59._8_4_ = auVar124._8_4_ * auVar124._8_4_;
          auVar59._12_4_ = auVar124._12_4_ * auVar124._12_4_;
          auVar59._16_4_ = auVar124._16_4_ * auVar124._16_4_;
          auVar59._20_4_ = auVar124._20_4_ * auVar124._20_4_;
          auVar59._24_4_ = auVar124._24_4_ * auVar124._24_4_;
          auVar59._28_4_ = local_540._28_4_;
          auVar198 = vcmpps_avx(auVar59,auVar196,2);
          local_420 = (int)lVar107;
          auVar197._4_4_ = local_420;
          auVar197._0_4_ = local_420;
          auVar197._8_4_ = local_420;
          auVar197._12_4_ = local_420;
          auVar197._16_4_ = local_420;
          auVar197._20_4_ = local_420;
          auVar197._24_4_ = local_420;
          auVar197._28_4_ = local_420;
          auVar134 = vpor_avx2(auVar197,_DAT_0205a920);
          auVar19 = vpcmpgtd_avx2(_local_580,auVar134);
          auVar134 = auVar19 & auVar198;
          if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar134 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar134 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar134 >> 0x7f,0) == '\0') &&
                (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar134 >> 0xbf,0) == '\0') &&
              (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar134[0x1f]) {
            auVar163 = ZEXT3264(local_680);
            auVar208 = ZEXT3264(auVar151);
            auVar199 = ZEXT3264(auVar199._0_32_);
            auVar143 = ZEXT3264(CONCAT428(fVar164,CONCAT424(fVar158,CONCAT420(fVar164,CONCAT416(
                                                  fVar158,CONCAT412(fVar164,CONCAT48(fVar158,uVar111
                                                                                    )))))));
          }
          else {
            local_560 = vandps_avx(auVar19,auVar198);
            local_8e0 = auVar99._0_4_;
            fStack_8dc = auVar99._4_4_;
            fStack_8d8 = auVar99._8_4_;
            fStack_8d4 = auVar99._12_4_;
            fStack_8d0 = auVar99._16_4_;
            fStack_8cc = auVar99._20_4_;
            fStack_8c8 = auVar99._24_4_;
            auVar60._4_4_ = (float)local_7a0._4_4_ * fStack_8dc;
            auVar60._0_4_ = (float)local_7a0._0_4_ * local_8e0;
            auVar60._8_4_ = fStack_798 * fStack_8d8;
            auVar60._12_4_ = fStack_794 * fStack_8d4;
            auVar60._16_4_ = fStack_790 * fStack_8d0;
            auVar60._20_4_ = fStack_78c * fStack_8cc;
            auVar60._24_4_ = fStack_788 * fStack_8c8;
            auVar60._28_4_ = auVar198._28_4_;
            auVar8 = vfmadd213ps_fma(auVar213,local_760,auVar60);
            auVar8 = vfmadd213ps_fma(auVar140,local_740,ZEXT1632(auVar8));
            auVar8 = vfmadd132ps_fma(auVar122,ZEXT1632(auVar8),local_660);
            auVar61._4_4_ = (float)local_7a0._4_4_ * local_920._4_4_;
            auVar61._0_4_ = (float)local_7a0._0_4_ * (float)local_920;
            auVar61._8_4_ = fStack_798 * fStack_918;
            auVar61._12_4_ = fStack_794 * fStack_914;
            auVar61._16_4_ = fStack_790 * fStack_910;
            auVar61._20_4_ = fStack_78c * fStack_90c;
            auVar61._24_4_ = fStack_788 * fStack_908;
            auVar61._28_4_ = auVar198._28_4_;
            auVar10 = vfmadd213ps_fma(local_780,local_760,auVar61);
            auVar10 = vfmadd213ps_fma(auVar125,local_740,ZEXT1632(auVar10));
            auVar125 = *(undefined1 (*) [32])(lVar20 + 0x222cd38 + lVar107 * 4);
            auVar140 = *(undefined1 (*) [32])(lVar20 + 0x222d1bc + lVar107 * 4);
            auVar213 = *(undefined1 (*) [32])(lVar20 + 0x222d640 + lVar107 * 4);
            pfVar3 = (float *)(lVar20 + 0x222dac4 + lVar107 * 4);
            fVar146 = *pfVar3;
            fVar145 = pfVar3[1];
            fVar126 = pfVar3[2];
            fVar127 = pfVar3[3];
            fVar128 = pfVar3[4];
            fVar129 = pfVar3[5];
            fVar130 = pfVar3[6];
            auVar62._4_4_ = fVar145 * fVar144;
            auVar62._0_4_ = fVar146 * fVar132;
            auVar62._8_4_ = fVar126 * fVar201;
            auVar62._12_4_ = fVar127 * fVar202;
            auVar62._16_4_ = fVar128 * fVar203;
            auVar62._20_4_ = fVar129 * fVar204;
            auVar62._24_4_ = fVar130 * fVar205;
            auVar62._28_4_ = auVar122._28_4_;
            auVar63._4_4_ = fVar145 * fVar164;
            auVar63._0_4_ = fVar146 * fVar158;
            auVar63._8_4_ = fVar126 * fVar158;
            auVar63._12_4_ = fVar127 * fVar164;
            auVar63._16_4_ = fVar128 * fVar158;
            auVar63._20_4_ = fVar129 * fVar164;
            auVar63._24_4_ = fVar130 * fVar158;
            auVar63._28_4_ = auVar124._28_4_;
            auVar64._4_4_ = (float)local_7a0._4_4_ * fVar145;
            auVar64._0_4_ = (float)local_7a0._0_4_ * fVar146;
            auVar64._8_4_ = fStack_798 * fVar126;
            auVar64._12_4_ = fStack_794 * fVar127;
            auVar64._16_4_ = fStack_790 * fVar128;
            auVar64._20_4_ = fStack_78c * fVar129;
            auVar64._24_4_ = fStack_788 * fVar130;
            auVar64._28_4_ = pfVar3[7];
            auVar11 = vfmadd231ps_fma(auVar62,auVar213,local_680);
            auVar12 = vfmadd231ps_fma(auVar63,auVar213,auVar210);
            auVar13 = vfmadd231ps_fma(auVar64,local_760,auVar213);
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar140,auVar220);
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar140,local_520);
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar140,local_740);
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar125,auVar195);
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar125,local_5a0);
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar125,local_660);
            pfVar3 = (float *)(lVar20 + 0x222fee4 + lVar107 * 4);
            fVar146 = *pfVar3;
            fVar145 = pfVar3[1];
            fVar126 = pfVar3[2];
            fVar127 = pfVar3[3];
            fVar128 = pfVar3[4];
            fVar129 = pfVar3[5];
            fVar130 = pfVar3[6];
            auVar100._4_4_ = fVar144 * fVar145;
            auVar100._0_4_ = fVar132 * fVar146;
            auVar100._8_4_ = fVar201 * fVar126;
            auVar100._12_4_ = fVar202 * fVar127;
            auVar100._16_4_ = fVar203 * fVar128;
            auVar100._20_4_ = fVar204 * fVar129;
            auVar100._24_4_ = fVar205 * fVar130;
            auVar100._28_4_ = uVar110;
            auVar65._4_4_ = fVar164 * fVar145;
            auVar65._0_4_ = fVar158 * fVar146;
            auVar65._8_4_ = fVar158 * fVar126;
            auVar65._12_4_ = fVar164 * fVar127;
            auVar65._16_4_ = fVar158 * fVar128;
            auVar65._20_4_ = fVar164 * fVar129;
            auVar65._24_4_ = fVar158 * fVar130;
            auVar65._28_4_ = auVar192._28_4_;
            auVar66._4_4_ = fVar145 * (float)local_7a0._4_4_;
            auVar66._0_4_ = fVar146 * (float)local_7a0._0_4_;
            auVar66._8_4_ = fVar126 * fStack_798;
            auVar66._12_4_ = fVar127 * fStack_794;
            auVar66._16_4_ = fVar128 * fStack_790;
            auVar66._20_4_ = fVar129 * fStack_78c;
            auVar66._24_4_ = fVar130 * fStack_788;
            auVar66._28_4_ = pfVar3[7];
            auVar125 = *(undefined1 (*) [32])(lVar20 + 0x222fa60 + lVar107 * 4);
            auVar112 = vfmadd231ps_fma(auVar100,auVar125,local_680);
            auVar178 = vfmadd231ps_fma(auVar65,auVar125,auVar210);
            auVar23 = vfmadd231ps_fma(auVar66,local_760,auVar125);
            auVar125 = *(undefined1 (*) [32])(lVar20 + 0x222f5dc + lVar107 * 4);
            auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar125,auVar220);
            auVar178 = vfmadd231ps_fma(ZEXT1632(auVar178),auVar125,local_520);
            auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar125,local_740);
            auVar125 = *(undefined1 (*) [32])(lVar20 + 0x222f158 + lVar107 * 4);
            auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar125,auVar195);
            auVar178 = vfmadd231ps_fma(ZEXT1632(auVar178),auVar125,local_5a0);
            auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),local_660,auVar125);
            auVar125 = vandps_avx(ZEXT1632(auVar11),local_2e0);
            auVar122 = vandps_avx(ZEXT1632(auVar12),local_2e0);
            auVar122 = vmaxps_avx(auVar125,auVar122);
            auVar125 = vandps_avx(ZEXT1632(auVar13),local_2e0);
            auVar125 = vmaxps_avx(auVar122,auVar125);
            auVar125 = vcmpps_avx(auVar125,_local_4c0,1);
            auVar140 = vblendvps_avx(ZEXT1632(auVar11),auVar192,auVar125);
            auVar213 = vblendvps_avx(ZEXT1632(auVar12),local_540,auVar125);
            auVar125 = vandps_avx(ZEXT1632(auVar112),local_2e0);
            auVar122 = vandps_avx(ZEXT1632(auVar178),local_2e0);
            auVar122 = vmaxps_avx(auVar125,auVar122);
            auVar125 = vandps_avx(local_2e0,ZEXT1632(auVar23));
            auVar125 = vmaxps_avx(auVar122,auVar125);
            auVar122 = vcmpps_avx(auVar125,_local_4c0,1);
            auVar125 = vblendvps_avx(ZEXT1632(auVar112),auVar192,auVar122);
            auVar122 = vblendvps_avx(ZEXT1632(auVar178),local_540,auVar122);
            auVar10 = vfmadd213ps_fma(auVar115,local_660,ZEXT1632(auVar10));
            auVar11 = vfmadd213ps_fma(auVar140,auVar140,ZEXT832(0) << 0x20);
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar213,auVar213);
            auVar115 = vrsqrtps_avx(ZEXT1632(auVar11));
            fVar146 = auVar115._0_4_;
            fVar145 = auVar115._4_4_;
            fVar126 = auVar115._8_4_;
            fVar127 = auVar115._12_4_;
            fVar128 = auVar115._16_4_;
            fVar129 = auVar115._20_4_;
            fVar130 = auVar115._24_4_;
            auVar67._4_4_ = fVar145 * fVar145 * fVar145 * auVar11._4_4_ * -0.5;
            auVar67._0_4_ = fVar146 * fVar146 * fVar146 * auVar11._0_4_ * -0.5;
            auVar67._8_4_ = fVar126 * fVar126 * fVar126 * auVar11._8_4_ * -0.5;
            auVar67._12_4_ = fVar127 * fVar127 * fVar127 * auVar11._12_4_ * -0.5;
            auVar67._16_4_ = fVar128 * fVar128 * fVar128 * -0.0;
            auVar67._20_4_ = fVar129 * fVar129 * fVar129 * -0.0;
            auVar67._24_4_ = fVar130 * fVar130 * fVar130 * -0.0;
            auVar67._28_4_ = 0;
            auVar173._8_4_ = 0x3fc00000;
            auVar173._0_8_ = 0x3fc000003fc00000;
            auVar173._12_4_ = 0x3fc00000;
            auVar173._16_4_ = 0x3fc00000;
            auVar173._20_4_ = 0x3fc00000;
            auVar173._24_4_ = 0x3fc00000;
            auVar173._28_4_ = 0x3fc00000;
            auVar11 = vfmadd231ps_fma(auVar67,auVar173,auVar115);
            fVar146 = auVar11._0_4_;
            fVar145 = auVar11._4_4_;
            auVar68._4_4_ = auVar213._4_4_ * fVar145;
            auVar68._0_4_ = auVar213._0_4_ * fVar146;
            fVar126 = auVar11._8_4_;
            auVar68._8_4_ = auVar213._8_4_ * fVar126;
            fVar127 = auVar11._12_4_;
            auVar68._12_4_ = auVar213._12_4_ * fVar127;
            auVar68._16_4_ = auVar213._16_4_ * 0.0;
            auVar68._20_4_ = auVar213._20_4_ * 0.0;
            auVar68._24_4_ = auVar213._24_4_ * 0.0;
            auVar68._28_4_ = auVar213._28_4_;
            auVar69._4_4_ = fVar145 * -auVar140._4_4_;
            auVar69._0_4_ = fVar146 * -auVar140._0_4_;
            auVar69._8_4_ = fVar126 * -auVar140._8_4_;
            auVar69._12_4_ = fVar127 * -auVar140._12_4_;
            auVar69._16_4_ = -auVar140._16_4_ * 0.0;
            auVar69._20_4_ = -auVar140._20_4_ * 0.0;
            auVar69._24_4_ = -auVar140._24_4_ * 0.0;
            auVar69._28_4_ = auVar115._28_4_;
            auVar11 = vfmadd213ps_fma(auVar125,auVar125,ZEXT832(0) << 0x20);
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar122,auVar122);
            auVar115 = vrsqrtps_avx(ZEXT1632(auVar11));
            auVar70._28_4_ = fVar164;
            auVar70._0_28_ =
                 ZEXT1628(CONCAT412(fVar127 * 0.0,
                                    CONCAT48(fVar126 * 0.0,CONCAT44(fVar145 * 0.0,fVar146 * 0.0))));
            fVar146 = auVar115._0_4_;
            fVar145 = auVar115._4_4_;
            fVar126 = auVar115._8_4_;
            fVar127 = auVar115._12_4_;
            fVar128 = auVar115._16_4_;
            fVar129 = auVar115._20_4_;
            fVar130 = auVar115._24_4_;
            auVar71._4_4_ = fVar145 * fVar145 * fVar145 * auVar11._4_4_ * -0.5;
            auVar71._0_4_ = fVar146 * fVar146 * fVar146 * auVar11._0_4_ * -0.5;
            auVar71._8_4_ = fVar126 * fVar126 * fVar126 * auVar11._8_4_ * -0.5;
            auVar71._12_4_ = fVar127 * fVar127 * fVar127 * auVar11._12_4_ * -0.5;
            auVar71._16_4_ = fVar128 * fVar128 * fVar128 * -0.0;
            auVar71._20_4_ = fVar129 * fVar129 * fVar129 * -0.0;
            auVar71._24_4_ = fVar130 * fVar130 * fVar130 * -0.0;
            auVar71._28_4_ = 0;
            auVar11 = vfmadd231ps_fma(auVar71,auVar173,auVar115);
            fVar146 = auVar11._0_4_;
            fVar145 = auVar11._4_4_;
            auVar72._4_4_ = auVar122._4_4_ * fVar145;
            auVar72._0_4_ = auVar122._0_4_ * fVar146;
            fVar126 = auVar11._8_4_;
            auVar72._8_4_ = auVar122._8_4_ * fVar126;
            fVar127 = auVar11._12_4_;
            auVar72._12_4_ = auVar122._12_4_ * fVar127;
            auVar72._16_4_ = auVar122._16_4_ * 0.0;
            auVar72._20_4_ = auVar122._20_4_ * 0.0;
            auVar72._24_4_ = auVar122._24_4_ * 0.0;
            auVar72._28_4_ = 0;
            auVar73._4_4_ = fVar145 * -auVar125._4_4_;
            auVar73._0_4_ = fVar146 * -auVar125._0_4_;
            auVar73._8_4_ = fVar126 * -auVar125._8_4_;
            auVar73._12_4_ = fVar127 * -auVar125._12_4_;
            auVar73._16_4_ = -auVar125._16_4_ * 0.0;
            auVar73._20_4_ = -auVar125._20_4_ * 0.0;
            auVar73._24_4_ = -auVar125._24_4_ * 0.0;
            auVar73._28_4_ = 0;
            auVar74._28_4_ = 0xbf000000;
            auVar74._0_28_ =
                 ZEXT1628(CONCAT412(fVar127 * 0.0,
                                    CONCAT48(fVar126 * 0.0,CONCAT44(fVar145 * 0.0,fVar146 * 0.0))));
            auVar11 = vfmadd213ps_fma(auVar68,ZEXT1632(auVar169),auVar188);
            auVar115 = ZEXT1632(auVar169);
            auVar12 = vfmadd213ps_fma(auVar69,auVar115,auVar116);
            auVar13 = vfmadd213ps_fma(auVar70,auVar115,ZEXT1632(auVar10));
            auVar23 = vfnmadd213ps_fma(auVar68,auVar115,auVar188);
            auVar112 = vfmadd213ps_fma(auVar72,ZEXT1632(auVar166),auVar135);
            auVar165 = vfnmadd213ps_fma(auVar69,auVar115,auVar116);
            auVar115 = ZEXT1632(auVar166);
            auVar178 = vfmadd213ps_fma(auVar73,auVar115,auVar155);
            auVar151 = ZEXT1632(auVar169);
            auVar169 = vfnmadd231ps_fma(ZEXT1632(auVar10),auVar151,auVar70);
            auVar10 = vfmadd213ps_fma(auVar74,auVar115,ZEXT1632(auVar8));
            auVar179 = vfnmadd213ps_fma(auVar72,auVar115,auVar135);
            auVar180 = vfnmadd213ps_fma(auVar73,auVar115,auVar155);
            auVar186 = vfnmadd231ps_fma(ZEXT1632(auVar8),ZEXT1632(auVar166),auVar74);
            auVar115 = vsubps_avx(ZEXT1632(auVar178),ZEXT1632(auVar165));
            auVar125 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar169));
            auVar183._0_4_ = auVar115._0_4_ * auVar169._0_4_;
            auVar183._4_4_ = auVar115._4_4_ * auVar169._4_4_;
            auVar183._8_4_ = auVar115._8_4_ * auVar169._8_4_;
            auVar183._12_4_ = auVar115._12_4_ * auVar169._12_4_;
            auVar183._16_4_ = auVar115._16_4_ * 0.0;
            auVar183._20_4_ = auVar115._20_4_ * 0.0;
            auVar183._24_4_ = auVar115._24_4_ * 0.0;
            auVar183._28_4_ = 0;
            auVar8 = vfmsub231ps_fma(auVar183,ZEXT1632(auVar165),auVar125);
            auVar75._4_4_ = auVar23._4_4_ * auVar125._4_4_;
            auVar75._0_4_ = auVar23._0_4_ * auVar125._0_4_;
            auVar75._8_4_ = auVar23._8_4_ * auVar125._8_4_;
            auVar75._12_4_ = auVar23._12_4_ * auVar125._12_4_;
            auVar75._16_4_ = auVar125._16_4_ * 0.0;
            auVar75._20_4_ = auVar125._20_4_ * 0.0;
            auVar75._24_4_ = auVar125._24_4_ * 0.0;
            auVar75._28_4_ = auVar125._28_4_;
            auVar198 = ZEXT1632(auVar23);
            auVar125 = vsubps_avx(ZEXT1632(auVar112),auVar198);
            auVar124 = ZEXT1632(auVar169);
            auVar169 = vfmsub231ps_fma(auVar75,auVar124,auVar125);
            auVar76._4_4_ = auVar165._4_4_ * auVar125._4_4_;
            auVar76._0_4_ = auVar165._0_4_ * auVar125._0_4_;
            auVar76._8_4_ = auVar165._8_4_ * auVar125._8_4_;
            auVar76._12_4_ = auVar165._12_4_ * auVar125._12_4_;
            auVar76._16_4_ = auVar125._16_4_ * 0.0;
            auVar76._20_4_ = auVar125._20_4_ * 0.0;
            auVar76._24_4_ = auVar125._24_4_ * 0.0;
            auVar76._28_4_ = auVar125._28_4_;
            auVar23 = vfmsub231ps_fma(auVar76,auVar198,auVar115);
            auVar169 = vfmadd231ps_fma(ZEXT1632(auVar23),ZEXT832(0) << 0x20,ZEXT1632(auVar169));
            auVar169 = vfmadd231ps_fma(ZEXT1632(auVar169),ZEXT832(0) << 0x20,ZEXT1632(auVar8));
            auVar134 = vcmpps_avx(ZEXT1632(auVar169),ZEXT832(0) << 0x20,2);
            auVar115 = vblendvps_avx(ZEXT1632(auVar179),ZEXT1632(auVar11),auVar134);
            auVar125 = vblendvps_avx(ZEXT1632(auVar180),ZEXT1632(auVar12),auVar134);
            local_780 = vblendvps_avx(ZEXT1632(auVar186),ZEXT1632(auVar13),auVar134);
            auVar122 = vblendvps_avx(auVar198,ZEXT1632(auVar112),auVar134);
            auVar140 = vblendvps_avx(ZEXT1632(auVar165),ZEXT1632(auVar178),auVar134);
            auVar213 = vblendvps_avx(auVar124,ZEXT1632(auVar10),auVar134);
            auVar198 = vblendvps_avx(ZEXT1632(auVar112),auVar198,auVar134);
            auVar192 = vblendvps_avx(ZEXT1632(auVar178),ZEXT1632(auVar165),auVar134);
            auVar169 = vpackssdw_avx(local_560._0_16_,local_560._16_16_);
            auVar124 = vblendvps_avx(ZEXT1632(auVar10),auVar124,auVar134);
            auVar198 = vsubps_avx(auVar198,auVar115);
            auVar192 = vsubps_avx(auVar192,auVar125);
            auVar19 = vsubps_avx(auVar124,local_780);
            auVar215 = ZEXT3264(auVar19);
            auVar155 = vsubps_avx(auVar115,auVar122);
            auVar116 = vsubps_avx(auVar125,auVar140);
            auVar135 = vsubps_avx(local_780,auVar213);
            auVar174._0_4_ = auVar19._0_4_ * auVar115._0_4_;
            auVar174._4_4_ = auVar19._4_4_ * auVar115._4_4_;
            auVar174._8_4_ = auVar19._8_4_ * auVar115._8_4_;
            auVar174._12_4_ = auVar19._12_4_ * auVar115._12_4_;
            auVar174._16_4_ = auVar19._16_4_ * auVar115._16_4_;
            auVar174._20_4_ = auVar19._20_4_ * auVar115._20_4_;
            auVar174._24_4_ = auVar19._24_4_ * auVar115._24_4_;
            auVar174._28_4_ = 0;
            auVar8 = vfmsub231ps_fma(auVar174,local_780,auVar198);
            auVar77._4_4_ = auVar198._4_4_ * auVar125._4_4_;
            auVar77._0_4_ = auVar198._0_4_ * auVar125._0_4_;
            auVar77._8_4_ = auVar198._8_4_ * auVar125._8_4_;
            auVar77._12_4_ = auVar198._12_4_ * auVar125._12_4_;
            auVar77._16_4_ = auVar198._16_4_ * auVar125._16_4_;
            auVar77._20_4_ = auVar198._20_4_ * auVar125._20_4_;
            auVar77._24_4_ = auVar198._24_4_ * auVar125._24_4_;
            auVar77._28_4_ = auVar124._28_4_;
            auVar10 = vfmsub231ps_fma(auVar77,auVar115,auVar192);
            auVar8 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT1632(auVar8),_DAT_02020f00);
            auVar175._0_4_ = auVar192._0_4_ * local_780._0_4_;
            auVar175._4_4_ = auVar192._4_4_ * local_780._4_4_;
            auVar175._8_4_ = auVar192._8_4_ * local_780._8_4_;
            auVar175._12_4_ = auVar192._12_4_ * local_780._12_4_;
            auVar175._16_4_ = auVar192._16_4_ * local_780._16_4_;
            auVar175._20_4_ = auVar192._20_4_ * local_780._20_4_;
            auVar175._24_4_ = auVar192._24_4_ * local_780._24_4_;
            auVar175._28_4_ = 0;
            auVar10 = vfmsub231ps_fma(auVar175,auVar125,auVar19);
            auVar10 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT832(0) << 0x20,ZEXT1632(auVar10));
            auVar176._0_4_ = auVar135._0_4_ * auVar122._0_4_;
            auVar176._4_4_ = auVar135._4_4_ * auVar122._4_4_;
            auVar176._8_4_ = auVar135._8_4_ * auVar122._8_4_;
            auVar176._12_4_ = auVar135._12_4_ * auVar122._12_4_;
            auVar176._16_4_ = auVar135._16_4_ * auVar122._16_4_;
            auVar176._20_4_ = auVar135._20_4_ * auVar122._20_4_;
            auVar176._24_4_ = auVar135._24_4_ * auVar122._24_4_;
            auVar176._28_4_ = 0;
            auVar8 = vfmsub231ps_fma(auVar176,auVar155,auVar213);
            auVar78._4_4_ = auVar116._4_4_ * auVar213._4_4_;
            auVar78._0_4_ = auVar116._0_4_ * auVar213._0_4_;
            auVar78._8_4_ = auVar116._8_4_ * auVar213._8_4_;
            auVar78._12_4_ = auVar116._12_4_ * auVar213._12_4_;
            auVar78._16_4_ = auVar116._16_4_ * auVar213._16_4_;
            auVar78._20_4_ = auVar116._20_4_ * auVar213._20_4_;
            auVar78._24_4_ = auVar116._24_4_ * auVar213._24_4_;
            auVar78._28_4_ = auVar213._28_4_;
            auVar11 = vfmsub231ps_fma(auVar78,auVar140,auVar135);
            auVar79._4_4_ = auVar155._4_4_ * auVar140._4_4_;
            auVar79._0_4_ = auVar155._0_4_ * auVar140._0_4_;
            auVar79._8_4_ = auVar155._8_4_ * auVar140._8_4_;
            auVar79._12_4_ = auVar155._12_4_ * auVar140._12_4_;
            auVar79._16_4_ = auVar155._16_4_ * auVar140._16_4_;
            auVar79._20_4_ = auVar155._20_4_ * auVar140._20_4_;
            auVar79._24_4_ = auVar155._24_4_ * auVar140._24_4_;
            auVar79._28_4_ = auVar140._28_4_;
            auVar12 = vfmsub231ps_fma(auVar79,auVar116,auVar122);
            auVar8 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar8));
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
            auVar122 = vmaxps_avx(ZEXT1632(auVar10),ZEXT1632(auVar11));
            auVar122 = vcmpps_avx(auVar122,ZEXT832(0) << 0x20,2);
            auVar185 = ZEXT1664(auVar122._16_16_);
            auVar8 = vpackssdw_avx(auVar122._0_16_,auVar122._16_16_);
            auVar8 = vpand_avx(auVar8,auVar169);
            auVar122 = vpmovsxwd_avx2(auVar8);
            if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar122 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar122 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar122 >> 0x7f,0) == '\0') &&
                  (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar122 >> 0xbf,0) == '\0') &&
                (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar122[0x1f]) {
LAB_01859c58:
              auVar162._8_8_ = uStack_5d8;
              auVar162._0_8_ = local_5e0;
              auVar162._16_8_ = uStack_5d0;
              auVar162._24_8_ = uStack_5c8;
            }
            else {
              auVar80._4_4_ = auVar192._4_4_ * auVar135._4_4_;
              auVar80._0_4_ = auVar192._0_4_ * auVar135._0_4_;
              auVar80._8_4_ = auVar192._8_4_ * auVar135._8_4_;
              auVar80._12_4_ = auVar192._12_4_ * auVar135._12_4_;
              auVar80._16_4_ = auVar192._16_4_ * auVar135._16_4_;
              auVar80._20_4_ = auVar192._20_4_ * auVar135._20_4_;
              auVar80._24_4_ = auVar192._24_4_ * auVar135._24_4_;
              auVar80._28_4_ = auVar122._28_4_;
              auVar178 = vfmsub231ps_fma(auVar80,auVar116,auVar19);
              auVar184._0_4_ = auVar19._0_4_ * auVar155._0_4_;
              auVar184._4_4_ = auVar19._4_4_ * auVar155._4_4_;
              auVar184._8_4_ = auVar19._8_4_ * auVar155._8_4_;
              auVar184._12_4_ = auVar19._12_4_ * auVar155._12_4_;
              auVar184._16_4_ = auVar19._16_4_ * auVar155._16_4_;
              auVar184._20_4_ = auVar19._20_4_ * auVar155._20_4_;
              auVar184._24_4_ = auVar19._24_4_ * auVar155._24_4_;
              auVar184._28_4_ = 0;
              auVar112 = vfmsub231ps_fma(auVar184,auVar198,auVar135);
              auVar81._4_4_ = auVar198._4_4_ * auVar116._4_4_;
              auVar81._0_4_ = auVar198._0_4_ * auVar116._0_4_;
              auVar81._8_4_ = auVar198._8_4_ * auVar116._8_4_;
              auVar81._12_4_ = auVar198._12_4_ * auVar116._12_4_;
              auVar81._16_4_ = auVar198._16_4_ * auVar116._16_4_;
              auVar81._20_4_ = auVar198._20_4_ * auVar116._20_4_;
              auVar81._24_4_ = auVar198._24_4_ * auVar116._24_4_;
              auVar81._28_4_ = auVar116._28_4_;
              auVar23 = vfmsub231ps_fma(auVar81,auVar155,auVar192);
              auVar12 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar112),ZEXT1632(auVar23));
              auVar13 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT1632(auVar178),ZEXT832(0) << 0x20);
              auVar122 = vrcpps_avx(ZEXT1632(auVar13));
              auVar214._8_4_ = 0x3f800000;
              auVar214._0_8_ = &DAT_3f8000003f800000;
              auVar214._12_4_ = 0x3f800000;
              auVar214._16_4_ = 0x3f800000;
              auVar214._20_4_ = 0x3f800000;
              auVar214._24_4_ = 0x3f800000;
              auVar214._28_4_ = 0x3f800000;
              auVar215 = ZEXT3264(auVar214);
              auVar12 = vfnmadd213ps_fma(auVar122,ZEXT1632(auVar13),auVar214);
              auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar122,auVar122);
              auVar160._0_4_ = auVar23._0_4_ * local_780._0_4_;
              auVar160._4_4_ = auVar23._4_4_ * local_780._4_4_;
              auVar160._8_4_ = auVar23._8_4_ * local_780._8_4_;
              auVar160._12_4_ = auVar23._12_4_ * local_780._12_4_;
              auVar160._16_4_ = local_780._16_4_ * 0.0;
              auVar160._20_4_ = local_780._20_4_ * 0.0;
              auVar160._24_4_ = local_780._24_4_ * 0.0;
              auVar160._28_4_ = 0;
              auVar112 = vfmadd231ps_fma(auVar160,ZEXT1632(auVar112),auVar125);
              auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar115,ZEXT1632(auVar178));
              fVar146 = auVar12._0_4_;
              fVar145 = auVar12._4_4_;
              fVar126 = auVar12._8_4_;
              fVar127 = auVar12._12_4_;
              auVar122 = ZEXT1632(CONCAT412(fVar127 * auVar112._12_4_,
                                            CONCAT48(fVar126 * auVar112._8_4_,
                                                     CONCAT44(fVar145 * auVar112._4_4_,
                                                              fVar146 * auVar112._0_4_))));
              uVar5 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar161._4_4_ = uVar5;
              auVar161._0_4_ = uVar5;
              auVar161._8_4_ = uVar5;
              auVar161._12_4_ = uVar5;
              auVar161._16_4_ = uVar5;
              auVar161._20_4_ = uVar5;
              auVar161._24_4_ = uVar5;
              auVar161._28_4_ = uVar5;
              auVar97._4_4_ = uStack_5bc;
              auVar97._0_4_ = local_5c0;
              auVar97._8_4_ = uStack_5b8;
              auVar97._12_4_ = uStack_5b4;
              auVar97._16_4_ = uStack_5b0;
              auVar97._20_4_ = uStack_5ac;
              auVar97._24_4_ = uStack_5a8;
              auVar97._28_4_ = uStack_5a4;
              auVar115 = vcmpps_avx(auVar97,auVar122,2);
              auVar125 = vcmpps_avx(auVar122,auVar161,2);
              auVar115 = vandps_avx(auVar125,auVar115);
              auVar12 = vpackssdw_avx(auVar115._0_16_,auVar115._16_16_);
              auVar8 = vpand_avx(auVar8,auVar12);
              auVar115 = vpmovsxwd_avx2(auVar8);
              auVar185 = ZEXT3264(auVar115);
              if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar115 >> 0x7f,0) == '\0') &&
                    (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar115 >> 0xbf,0) == '\0') &&
                  (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar115[0x1f]) goto LAB_01859c58;
              auVar115 = vcmpps_avx(ZEXT1632(auVar13),ZEXT832(0) << 0x20,4);
              auVar12 = vpackssdw_avx(auVar115._0_16_,auVar115._16_16_);
              auVar8 = vpand_avx(auVar8,auVar12);
              auVar115 = vpmovsxwd_avx2(auVar8);
              auVar185 = ZEXT3264(auVar115);
              auVar162._8_8_ = uStack_5d8;
              auVar162._0_8_ = local_5e0;
              auVar162._16_8_ = uStack_5d0;
              auVar162._24_8_ = uStack_5c8;
              if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar115 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar115 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar115 >> 0x7f,0) != '\0') ||
                    (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar115 >> 0xbf,0) != '\0') ||
                  (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar115[0x1f] < '\0') {
                auVar140 = ZEXT1632(CONCAT412(fVar127 * auVar10._12_4_,
                                              CONCAT48(fVar126 * auVar10._8_4_,
                                                       CONCAT44(fVar145 * auVar10._4_4_,
                                                                fVar146 * auVar10._0_4_))));
                auVar82._28_4_ = SUB84(uStack_5c8,4);
                auVar82._0_28_ =
                     ZEXT1628(CONCAT412(fVar127 * auVar11._12_4_,
                                        CONCAT48(fVar126 * auVar11._8_4_,
                                                 CONCAT44(fVar145 * auVar11._4_4_,
                                                          fVar146 * auVar11._0_4_))));
                auVar193._8_4_ = 0x3f800000;
                auVar193._0_8_ = &DAT_3f8000003f800000;
                auVar193._12_4_ = 0x3f800000;
                auVar193._16_4_ = 0x3f800000;
                auVar193._20_4_ = 0x3f800000;
                auVar193._24_4_ = 0x3f800000;
                auVar193._28_4_ = 0x3f800000;
                auVar125 = vsubps_avx(auVar193,auVar140);
                _local_320 = vblendvps_avx(auVar125,auVar140,auVar134);
                auVar125 = vsubps_avx(auVar193,auVar82);
                local_500 = vblendvps_avx(auVar125,auVar82,auVar134);
                local_340 = auVar122;
                auVar162 = auVar115;
              }
            }
            auVar208 = ZEXT3264(auVar210);
            auVar199 = ZEXT3264(CONCAT428(fStack_704,
                                          CONCAT424(fStack_708,
                                                    CONCAT420(fStack_70c,
                                                              CONCAT416(fStack_710,
                                                                        CONCAT412(fStack_714,
                                                                                  CONCAT48(
                                                  fStack_718,CONCAT44(fStack_71c,local_720))))))));
            if ((((((((auVar162 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar162 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar162 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar162 >> 0x7f,0) == '\0') &&
                  (auVar162 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar162 >> 0xbf,0) == '\0') &&
                (auVar162 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar162[0x1f]) {
              auVar163 = ZEXT3264(local_680);
              auVar143 = ZEXT3264(CONCAT428(fVar164,CONCAT424(fVar158,CONCAT420(fVar164,CONCAT416(
                                                  fVar158,CONCAT412(fVar164,CONCAT48(fVar158,uVar111
                                                                                    )))))));
            }
            else {
              auVar115 = vsubps_avx(ZEXT1632(auVar166),auVar151);
              auVar166 = vfmadd213ps_fma(auVar115,_local_320,auVar151);
              fVar146 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
              auVar83._4_4_ = (auVar166._4_4_ + auVar166._4_4_) * fVar146;
              auVar83._0_4_ = (auVar166._0_4_ + auVar166._0_4_) * fVar146;
              auVar83._8_4_ = (auVar166._8_4_ + auVar166._8_4_) * fVar146;
              auVar83._12_4_ = (auVar166._12_4_ + auVar166._12_4_) * fVar146;
              auVar83._16_4_ = fVar146 * 0.0;
              auVar83._20_4_ = fVar146 * 0.0;
              auVar83._24_4_ = fVar146 * 0.0;
              auVar83._28_4_ = fVar146;
              auVar115 = vcmpps_avx(local_340,auVar83,6);
              auVar125 = auVar162 & auVar115;
              if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar125 >> 0x7f,0) == '\0') &&
                    (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar125 >> 0xbf,0) == '\0') &&
                  (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar125[0x1f]) {
                auVar143 = ZEXT3264(CONCAT428(fVar164,CONCAT424(fVar158,CONCAT420(fVar164,CONCAT416(
                                                  fVar158,CONCAT412(fVar164,CONCAT48(fVar158,uVar111
                                                                                    )))))));
              }
              else {
                local_3c0 = vandps_avx(auVar115,auVar162);
                auVar142._8_4_ = 0xbf800000;
                auVar142._0_8_ = 0xbf800000bf800000;
                auVar142._12_4_ = 0xbf800000;
                auVar142._16_4_ = 0xbf800000;
                auVar142._20_4_ = 0xbf800000;
                auVar142._24_4_ = 0xbf800000;
                auVar142._28_4_ = 0xbf800000;
                auVar156._8_4_ = 0x40000000;
                auVar156._0_8_ = 0x4000000040000000;
                auVar156._12_4_ = 0x40000000;
                auVar156._16_4_ = 0x40000000;
                auVar156._20_4_ = 0x40000000;
                auVar156._24_4_ = 0x40000000;
                auVar156._28_4_ = 0x40000000;
                auVar166 = vfmadd213ps_fma(local_500,auVar156,auVar142);
                local_480 = _local_320;
                local_460 = ZEXT1632(auVar166);
                local_440 = local_340;
                local_400 = local_5f0._0_8_;
                uStack_3f8 = local_5f0._8_8_;
                local_3f0 = local_600._0_8_;
                uStack_3e8 = local_600._8_8_;
                local_3e0 = local_610._0_8_;
                uStack_3d8 = local_610._8_8_;
                pGVar15 = (context->scene->geometries).items[uVar104].ptr;
                local_500 = local_460;
                if ((pGVar15->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  bVar106 = 0;
                  auVar143 = ZEXT3264(CONCAT428(fVar164,CONCAT424(fVar158,CONCAT420(fVar164,
                                                  CONCAT416(fVar158,CONCAT412(fVar164,CONCAT48(
                                                  fVar158,uVar111)))))));
                }
                else {
                  auVar143 = ZEXT3264(CONCAT428(fVar164,CONCAT424(fVar158,CONCAT420(fVar164,
                                                  CONCAT416(fVar158,CONCAT412(fVar164,CONCAT48(
                                                  fVar158,uVar111)))))));
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (bVar106 = 1, pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar146 = (float)local_420;
                    local_3a0[0] = (fVar146 + (float)local_320._0_4_ + 0.0) * local_180;
                    local_3a0[1] = (fVar146 + (float)local_320._4_4_ + 1.0) * fStack_17c;
                    local_3a0[2] = (fVar146 + fStack_318 + 2.0) * fStack_178;
                    local_3a0[3] = (fVar146 + fStack_314 + 3.0) * fStack_174;
                    fStack_390 = (fVar146 + fStack_310 + 4.0) * fStack_170;
                    fStack_38c = (fVar146 + fStack_30c + 5.0) * fStack_16c;
                    fStack_388 = (fVar146 + fStack_308 + 6.0) * fStack_168;
                    fStack_384 = fVar146 + fStack_304 + 7.0;
                    local_500._0_8_ = auVar166._0_8_;
                    local_500._8_8_ = auVar166._8_8_;
                    local_380 = local_500._0_8_;
                    uStack_378 = local_500._8_8_;
                    uStack_370 = 0;
                    uStack_368 = 0;
                    local_360 = local_340._0_8_;
                    uStack_358 = local_340._8_8_;
                    uStack_350 = local_340._16_8_;
                    uStack_348 = local_340._24_8_;
                    uVar102 = vmovmskps_avx(local_3c0);
                    local_700 = ZEXT1632(CONCAT124(auVar9._4_12_,
                                                   (int)CONCAT71((int7)((ulong)context >> 8),
                                                                 uVar102 != 0)));
                    if (uVar102 != 0) {
                      lVar21 = 0;
                      local_920 = (ulong)(uVar102 & 0xff);
                      for (uVar103 = local_920; (uVar103 & 1) == 0;
                          uVar103 = uVar103 >> 1 | 0x8000000000000000) {
                        lVar21 = lVar21 + 1;
                      }
                      _local_960 = ZEXT1632(CONCAT88(auVar169._8_8_,lVar21));
                      local_6a0 = ZEXT1632(local_5f0);
                      local_6c0 = ZEXT1632(local_600);
                      _local_6e0 = ZEXT1632(local_610);
                      local_41c = iVar101;
                      local_410 = uVar177;
                      uStack_408 = uVar92;
                      do {
                        local_780._0_4_ = *(undefined4 *)(ray + k * 4 + 0x100);
                        fVar146 = local_3a0[(long)local_960];
                        auVar114._4_4_ = fVar146;
                        auVar114._0_4_ = fVar146;
                        auVar114._8_4_ = fVar146;
                        auVar114._12_4_ = fVar146;
                        local_240._16_4_ = fVar146;
                        local_240._0_16_ = auVar114;
                        local_240._20_4_ = fVar146;
                        local_240._24_4_ = fVar146;
                        local_240._28_4_ = fVar146;
                        local_220._4_4_ = *(undefined4 *)((long)&local_380 + (long)local_960 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)((long)&local_360 + (long)local_960 * 4);
                        fVar126 = 1.0 - fVar146;
                        auVar169 = ZEXT416((uint)(fVar146 * fVar126 * 4.0));
                        auVar166 = vfnmsub213ss_fma(auVar114,auVar114,auVar169);
                        auVar169 = vfmadd213ss_fma(ZEXT416((uint)fVar126),ZEXT416((uint)fVar126),
                                                   auVar169);
                        auVar185 = ZEXT464(0x3f000000);
                        fVar145 = auVar169._0_4_ * 0.5;
                        fVar146 = fVar146 * fVar146 * 0.5;
                        auVar170._0_4_ = fVar146 * (float)local_6e0._0_4_;
                        auVar170._4_4_ = fVar146 * (float)local_6e0._4_4_;
                        auVar170._8_4_ = fVar146 * fStack_6d8;
                        auVar170._12_4_ = fVar146 * fStack_6d4;
                        auVar149._4_4_ = fVar145;
                        auVar149._0_4_ = fVar145;
                        auVar149._8_4_ = fVar145;
                        auVar149._12_4_ = fVar145;
                        auVar169 = vfmadd132ps_fma(auVar149,auVar170,local_6c0._0_16_);
                        fVar146 = auVar166._0_4_ * 0.5;
                        auVar171._4_4_ = fVar146;
                        auVar171._0_4_ = fVar146;
                        auVar171._8_4_ = fVar146;
                        auVar171._12_4_ = fVar146;
                        auVar169 = vfmadd132ps_fma(auVar171,auVar169,local_6a0._0_16_);
                        local_7d0.context = context->user;
                        fVar146 = fVar126 * -fVar126 * 0.5;
                        auVar150._4_4_ = fVar146;
                        auVar150._0_4_ = fVar146;
                        auVar150._8_4_ = fVar146;
                        auVar150._12_4_ = fVar146;
                        auVar166 = vfmadd132ps_fma(auVar150,auVar169,auVar18);
                        local_2a0 = auVar166._0_4_;
                        uStack_29c = local_2a0;
                        uStack_298 = local_2a0;
                        uStack_294 = local_2a0;
                        uStack_290 = local_2a0;
                        uStack_28c = local_2a0;
                        uStack_288 = local_2a0;
                        uStack_284 = local_2a0;
                        auVar169 = vmovshdup_avx(auVar166);
                        local_280 = auVar169._0_8_;
                        uStack_278 = local_280;
                        uStack_270 = local_280;
                        uStack_268 = local_280;
                        auVar169 = vshufps_avx(auVar166,auVar166,0xaa);
                        local_260 = auVar169._0_8_;
                        uStack_258 = local_260;
                        uStack_250 = local_260;
                        uStack_248 = local_260;
                        local_220._0_4_ = local_220._4_4_;
                        local_220._8_4_ = local_220._4_4_;
                        local_220._12_4_ = local_220._4_4_;
                        local_220._16_4_ = local_220._4_4_;
                        local_220._20_4_ = local_220._4_4_;
                        local_220._24_4_ = local_220._4_4_;
                        local_220._28_4_ = local_220._4_4_;
                        local_200 = CONCAT44(uStack_15c,local_160);
                        uStack_1f8 = CONCAT44(uStack_154,uStack_158);
                        uStack_1f0 = CONCAT44(uStack_14c,uStack_150);
                        uStack_1e8 = CONCAT44(uStack_144,uStack_148);
                        local_1e0._4_4_ = uStack_13c;
                        local_1e0._0_4_ = local_140;
                        local_1e0._8_4_ = uStack_138;
                        local_1e0._12_4_ = uStack_134;
                        local_1e0._16_4_ = uStack_130;
                        local_1e0._20_4_ = uStack_12c;
                        local_1e0._24_4_ = uStack_128;
                        local_1e0._28_4_ = uStack_124;
                        vpcmpeqd_avx2(local_1e0,local_1e0);
                        local_1c0 = (local_7d0.context)->instID[0];
                        uStack_1bc = local_1c0;
                        uStack_1b8 = local_1c0;
                        uStack_1b4 = local_1c0;
                        uStack_1b0 = local_1c0;
                        uStack_1ac = local_1c0;
                        uStack_1a8 = local_1c0;
                        uStack_1a4 = local_1c0;
                        local_1a0 = (local_7d0.context)->instPrimID[0];
                        uStack_19c = local_1a0;
                        uStack_198 = local_1a0;
                        uStack_194 = local_1a0;
                        uStack_190 = local_1a0;
                        uStack_18c = local_1a0;
                        uStack_188 = local_1a0;
                        uStack_184 = local_1a0;
                        local_640 = local_300._0_8_;
                        uStack_638 = local_300._8_8_;
                        uStack_630 = local_300._16_8_;
                        uStack_628 = local_300._24_8_;
                        local_7d0.valid = (int *)&local_640;
                        local_7d0.geometryUserPtr = pGVar15->userPtr;
                        local_7d0.hit = (RTCHitN *)&local_2a0;
                        local_7d0.N = 8;
                        local_7d0.ray = (RTCRayN *)ray;
                        if (pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar185 = ZEXT1664(auVar185._0_16_);
                          auVar215 = ZEXT1664(auVar215._0_16_);
                          (*pGVar15->occlusionFilterN)(&local_7d0);
                        }
                        auVar95._8_8_ = uStack_638;
                        auVar95._0_8_ = local_640;
                        auVar95._16_8_ = uStack_630;
                        auVar95._24_8_ = uStack_628;
                        auVar125 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar95)
                        ;
                        auVar115 = _DAT_0205a980 & ~auVar125;
                        if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar115 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar115 >> 0x7f,0) == '\0')
                              && (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar115 >> 0xbf,0) == '\0') &&
                            (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar115[0x1f]) {
                          auVar125 = auVar125 ^ _DAT_0205a980;
                        }
                        else {
                          p_Var17 = context->args->filter;
                          if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar15->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar185 = ZEXT1664(auVar185._0_16_);
                            auVar215 = ZEXT1664(auVar215._0_16_);
                            (*p_Var17)(&local_7d0);
                          }
                          auVar96._8_8_ = uStack_638;
                          auVar96._0_8_ = local_640;
                          auVar96._16_8_ = uStack_630;
                          auVar96._24_8_ = uStack_628;
                          auVar115 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                                                   auVar96);
                          auVar125 = auVar115 ^ _DAT_0205a980;
                          auVar157._8_4_ = 0xff800000;
                          auVar157._0_8_ = 0xff800000ff800000;
                          auVar157._12_4_ = 0xff800000;
                          auVar157._16_4_ = 0xff800000;
                          auVar157._20_4_ = 0xff800000;
                          auVar157._24_4_ = 0xff800000;
                          auVar157._28_4_ = 0xff800000;
                          auVar115 = vblendvps_avx(auVar157,*(undefined1 (*) [32])
                                                             (local_7d0.ray + 0x100),auVar115);
                          *(undefined1 (*) [32])(local_7d0.ray + 0x100) = auVar115;
                        }
                        if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar125 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar125 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar125 >> 0x7f,0) != '\0')
                              || (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar125 >> 0xbf,0) != '\0') ||
                            (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar125[0x1f] < '\0') break;
                        *(undefined4 *)(ray + k * 4 + 0x100) = local_780._0_4_;
                        lVar21 = 0;
                        local_920 = local_920 ^ 1L << ((ulong)local_960 & 0x3f);
                        for (uVar103 = local_920; (uVar103 & 1) == 0;
                            uVar103 = uVar103 >> 1 | 0x8000000000000000) {
                          lVar21 = lVar21 + 1;
                        }
                        local_960 = (undefined1  [8])lVar21;
                        local_700._0_4_ = (int)CONCAT71((int7)((ulong)lVar21 >> 8),local_920 != 0);
                      } while (local_920 != 0);
                    }
                    bVar106 = local_700[0] & 1;
                    auVar199 = ZEXT3264(CONCAT428(fStack_704,
                                                  CONCAT424(fStack_708,
                                                            CONCAT420(fStack_70c,
                                                                      CONCAT416(fStack_710,
                                                                                CONCAT412(fStack_714
                                                                                          ,CONCAT48(
                                                  fStack_718,CONCAT44(fStack_71c,local_720))))))));
                    auVar143 = ZEXT3264(CONCAT428(fVar164,CONCAT424(fVar158,CONCAT420(fVar164,
                                                  CONCAT416(fVar158,CONCAT412(fVar164,CONCAT48(
                                                  fVar158,uVar111)))))));
                  }
                }
                local_800._0_4_ = ZEXT14((byte)((byte)local_800._0_4_ | bVar106));
              }
              auVar208 = ZEXT3264(auVar210);
              auVar163 = ZEXT3264(local_680);
            }
          }
          lVar107 = lVar107 + 8;
        } while ((int)lVar107 < iVar101);
      }
      if (local_800._0_4_ != 0) {
        return bVar109;
      }
      uVar110 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar123._4_4_ = uVar110;
      auVar123._0_4_ = uVar110;
      auVar123._8_4_ = uVar110;
      auVar123._12_4_ = uVar110;
      auVar123._16_4_ = uVar110;
      auVar123._20_4_ = uVar110;
      auVar123._24_4_ = uVar110;
      auVar123._28_4_ = uVar110;
      auVar115 = vcmpps_avx(local_80,auVar123,2);
      uVar104 = vmovmskps_avx(auVar115);
      uVar104 = (uint)uVar108 & uVar104;
      bVar109 = uVar104 != 0;
    } while (bVar109);
  }
  return bVar109;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }